

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx2::CurveNvIntersector1<8>::
     intersect_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int iVar15;
  ulong uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  long lVar60;
  undefined1 auVar61 [12];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 (*pauVar70) [32];
  uint uVar71;
  uint uVar72;
  uint uVar73;
  long lVar74;
  ulong uVar75;
  ulong uVar76;
  int iVar77;
  ulong uVar78;
  undefined4 uVar79;
  undefined8 uVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar83 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar123;
  float fVar124;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar116 [32];
  float fVar125;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar165;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar166;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar185;
  undefined4 uVar186;
  float fVar198;
  float fVar199;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [64];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  float fVar226;
  float fVar231;
  undefined1 auVar227 [16];
  float fVar229;
  float fVar230;
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 in_ZMM10 [64];
  undefined1 auVar228 [64];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar241;
  float fVar242;
  undefined1 auVar235 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar243 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [64];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_aec;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  RTCFilterFunctionNArguments local_a78;
  int local_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined8 local_8f0;
  float local_8e8;
  float local_8e4;
  undefined4 local_8e0;
  uint local_8dc;
  uint local_8d8;
  uint local_8d4;
  uint local_8d0;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 auStack_790 [16];
  undefined1 local_780 [16];
  Primitive *local_768;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined4 uStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined4 uStack_564;
  undefined1 local_560 [32];
  uint local_540;
  uint uStack_53c;
  uint uStack_538;
  uint uStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  uint uStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_430 [16];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar6 = prim[1];
  uVar78 = (ulong)(byte)PVar6;
  lVar60 = uVar78 * 0x19;
  fVar103 = *(float *)(prim + lVar60 + 0x12);
  auVar85 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar60 + 6));
  auVar81._0_4_ = fVar103 * auVar85._0_4_;
  auVar81._4_4_ = fVar103 * auVar85._4_4_;
  auVar81._8_4_ = fVar103 * auVar85._8_4_;
  auVar81._12_4_ = fVar103 * auVar85._12_4_;
  auVar209._0_4_ = fVar103 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar209._4_4_ = fVar103 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar209._8_4_ = fVar103 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar209._12_4_ = fVar103 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar78 * 4 + 6);
  auVar92 = vpmovsxbd_avx2(auVar85);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar78 * 5 + 6);
  auVar235 = vpmovsxbd_avx2(auVar3);
  auVar235 = vcvtdq2ps_avx(auVar235);
  auVar171._8_8_ = 0;
  auVar171._0_8_ = *(ulong *)(prim + uVar78 * 6 + 6);
  auVar9 = vpmovsxbd_avx2(auVar171);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + uVar78 * 0xb + 6);
  auVar138 = vpmovsxbd_avx2(auVar132);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  auVar10 = vpmovsxbd_avx2(auVar192);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + (uint)(byte)PVar6 * 0xc + uVar78 + 6);
  auVar11 = vpmovsxbd_avx2(auVar89);
  auVar11 = vcvtdq2ps_avx(auVar11);
  uVar76 = (ulong)(uint)((int)(uVar78 * 9) * 2);
  auVar211._8_8_ = 0;
  auVar211._0_8_ = *(ulong *)(prim + uVar76 + 6);
  auVar12 = vpmovsxbd_avx2(auVar211);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar76 + uVar78 + 6);
  auVar13 = vpmovsxbd_avx2(auVar4);
  auVar13 = vcvtdq2ps_avx(auVar13);
  uVar76 = (ulong)(uint)((int)(uVar78 * 5) << 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar76 + 6);
  auVar14 = vpmovsxbd_avx2(auVar5);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar249._4_4_ = auVar209._0_4_;
  auVar249._0_4_ = auVar209._0_4_;
  auVar249._8_4_ = auVar209._0_4_;
  auVar249._12_4_ = auVar209._0_4_;
  auVar249._16_4_ = auVar209._0_4_;
  auVar249._20_4_ = auVar209._0_4_;
  auVar249._24_4_ = auVar209._0_4_;
  auVar249._28_4_ = auVar209._0_4_;
  auVar85 = vmovshdup_avx(auVar209);
  uVar80 = auVar85._0_8_;
  auVar253._8_8_ = uVar80;
  auVar253._0_8_ = uVar80;
  auVar253._16_8_ = uVar80;
  auVar253._24_8_ = uVar80;
  auVar85 = vshufps_avx(auVar209,auVar209,0xaa);
  fVar103 = auVar85._0_4_;
  auVar222._0_4_ = fVar103 * auVar9._0_4_;
  fVar123 = auVar85._4_4_;
  auVar222._4_4_ = fVar123 * auVar9._4_4_;
  auVar222._8_4_ = fVar103 * auVar9._8_4_;
  auVar222._12_4_ = fVar123 * auVar9._12_4_;
  auVar222._16_4_ = fVar103 * auVar9._16_4_;
  auVar222._20_4_ = fVar123 * auVar9._20_4_;
  auVar222._28_36_ = in_ZMM12._28_36_;
  auVar222._24_4_ = fVar103 * auVar9._24_4_;
  auVar216._0_4_ = auVar11._0_4_ * fVar103;
  auVar216._4_4_ = auVar11._4_4_ * fVar123;
  auVar216._8_4_ = auVar11._8_4_ * fVar103;
  auVar216._12_4_ = auVar11._12_4_ * fVar123;
  auVar216._16_4_ = auVar11._16_4_ * fVar103;
  auVar216._20_4_ = auVar11._20_4_ * fVar123;
  auVar216._28_36_ = in_ZMM10._28_36_;
  auVar216._24_4_ = auVar11._24_4_ * fVar103;
  auVar224._0_4_ = auVar14._0_4_ * fVar103;
  auVar224._4_4_ = auVar14._4_4_ * fVar123;
  auVar224._8_4_ = auVar14._8_4_ * fVar103;
  auVar224._12_4_ = auVar14._12_4_ * fVar123;
  auVar224._16_4_ = auVar14._16_4_ * fVar103;
  auVar224._20_4_ = auVar14._20_4_ * fVar123;
  auVar224._24_4_ = auVar14._24_4_ * fVar103;
  auVar224._28_4_ = 0;
  auVar85 = vfmadd231ps_fma(auVar222._0_32_,auVar253,auVar235);
  auVar3 = vfmadd231ps_fma(auVar216._0_32_,auVar253,auVar10);
  auVar171 = vfmadd231ps_fma(auVar224,auVar13,auVar253);
  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar249,auVar92);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar249,auVar138);
  auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar12,auVar249);
  auVar250._4_4_ = auVar81._0_4_;
  auVar250._0_4_ = auVar81._0_4_;
  auVar250._8_4_ = auVar81._0_4_;
  auVar250._12_4_ = auVar81._0_4_;
  auVar250._16_4_ = auVar81._0_4_;
  auVar250._20_4_ = auVar81._0_4_;
  auVar250._24_4_ = auVar81._0_4_;
  auVar250._28_4_ = auVar81._0_4_;
  auVar85 = vmovshdup_avx(auVar81);
  uVar80 = auVar85._0_8_;
  auVar254._8_8_ = uVar80;
  auVar254._0_8_ = uVar80;
  auVar254._16_8_ = uVar80;
  auVar254._24_8_ = uVar80;
  auVar85 = vshufps_avx(auVar81,auVar81,0xaa);
  fVar103 = auVar85._0_4_;
  auVar212._0_4_ = fVar103 * auVar9._0_4_;
  fVar123 = auVar85._4_4_;
  auVar212._4_4_ = fVar123 * auVar9._4_4_;
  auVar212._8_4_ = fVar103 * auVar9._8_4_;
  auVar212._12_4_ = fVar123 * auVar9._12_4_;
  auVar212._16_4_ = fVar103 * auVar9._16_4_;
  auVar212._20_4_ = fVar123 * auVar9._20_4_;
  auVar212._24_4_ = fVar103 * auVar9._24_4_;
  auVar212._28_4_ = 0;
  auVar137._4_4_ = auVar11._4_4_ * fVar123;
  auVar137._0_4_ = auVar11._0_4_ * fVar103;
  auVar137._8_4_ = auVar11._8_4_ * fVar103;
  auVar137._12_4_ = auVar11._12_4_ * fVar123;
  auVar137._16_4_ = auVar11._16_4_ * fVar103;
  auVar137._20_4_ = auVar11._20_4_ * fVar123;
  auVar137._24_4_ = auVar11._24_4_ * fVar103;
  auVar137._28_4_ = auVar9._28_4_;
  auVar9._4_4_ = auVar14._4_4_ * fVar123;
  auVar9._0_4_ = auVar14._0_4_ * fVar103;
  auVar9._8_4_ = auVar14._8_4_ * fVar103;
  auVar9._12_4_ = auVar14._12_4_ * fVar123;
  auVar9._16_4_ = auVar14._16_4_ * fVar103;
  auVar9._20_4_ = auVar14._20_4_ * fVar123;
  auVar9._24_4_ = auVar14._24_4_ * fVar103;
  auVar9._28_4_ = fVar123;
  auVar85 = vfmadd231ps_fma(auVar212,auVar254,auVar235);
  auVar192 = vfmadd231ps_fma(auVar137,auVar254,auVar10);
  auVar89 = vfmadd231ps_fma(auVar9,auVar254,auVar13);
  auVar211 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar250,auVar92);
  auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar250,auVar138);
  local_720._8_4_ = 0x7fffffff;
  local_720._0_8_ = 0x7fffffff7fffffff;
  local_720._12_4_ = 0x7fffffff;
  local_720._16_4_ = 0x7fffffff;
  local_720._20_4_ = 0x7fffffff;
  local_720._24_4_ = 0x7fffffff;
  local_720._28_4_ = 0x7fffffff;
  auVar217._8_4_ = 0x219392ef;
  auVar217._0_8_ = 0x219392ef219392ef;
  auVar217._12_4_ = 0x219392ef;
  auVar217._16_4_ = 0x219392ef;
  auVar217._20_4_ = 0x219392ef;
  auVar217._24_4_ = 0x219392ef;
  auVar217._28_4_ = 0x219392ef;
  auVar92 = vandps_avx(ZEXT1632(auVar132),local_720);
  auVar92 = vcmpps_avx(auVar92,auVar217,1);
  auVar235 = vblendvps_avx(ZEXT1632(auVar132),auVar217,auVar92);
  auVar92 = vandps_avx(ZEXT1632(auVar3),local_720);
  auVar92 = vcmpps_avx(auVar92,auVar217,1);
  auVar9 = vblendvps_avx(ZEXT1632(auVar3),auVar217,auVar92);
  auVar92 = vandps_avx(ZEXT1632(auVar171),local_720);
  auVar92 = vcmpps_avx(auVar92,auVar217,1);
  auVar92 = vblendvps_avx(ZEXT1632(auVar171),auVar217,auVar92);
  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar250,auVar12);
  auVar138 = vrcpps_avx(auVar235);
  auVar159._8_4_ = 0x3f800000;
  auVar159._0_8_ = 0x3f8000003f800000;
  auVar159._12_4_ = 0x3f800000;
  auVar159._16_4_ = 0x3f800000;
  auVar159._20_4_ = 0x3f800000;
  auVar159._24_4_ = 0x3f800000;
  auVar159._28_4_ = 0x3f800000;
  auVar85 = vfnmadd213ps_fma(auVar235,auVar138,auVar159);
  auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar138,auVar138);
  auVar235 = vrcpps_avx(auVar9);
  auVar3 = vfnmadd213ps_fma(auVar9,auVar235,auVar159);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar235,auVar235);
  auVar235 = vrcpps_avx(auVar92);
  auVar171 = vfnmadd213ps_fma(auVar92,auVar235,auVar159);
  auVar171 = vfmadd132ps_fma(ZEXT1632(auVar171),auVar235,auVar235);
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 7 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar211));
  auVar138._4_4_ = auVar85._4_4_ * auVar92._4_4_;
  auVar138._0_4_ = auVar85._0_4_ * auVar92._0_4_;
  auVar138._8_4_ = auVar85._8_4_ * auVar92._8_4_;
  auVar138._12_4_ = auVar85._12_4_ * auVar92._12_4_;
  auVar138._16_4_ = auVar92._16_4_ * 0.0;
  auVar138._20_4_ = auVar92._20_4_ * 0.0;
  auVar138._24_4_ = auVar92._24_4_ * 0.0;
  auVar138._28_4_ = auVar92._28_4_;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 9 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar211));
  auVar10._4_4_ = auVar85._4_4_ * auVar92._4_4_;
  auVar10._0_4_ = auVar85._0_4_ * auVar92._0_4_;
  auVar10._8_4_ = auVar85._8_4_ * auVar92._8_4_;
  auVar10._12_4_ = auVar85._12_4_ * auVar92._12_4_;
  auVar10._16_4_ = auVar92._16_4_ * 0.0;
  auVar10._20_4_ = auVar92._20_4_ * 0.0;
  auVar10._24_4_ = auVar92._24_4_ * 0.0;
  auVar10._28_4_ = auVar92._28_4_;
  auVar116._1_3_ = 0;
  auVar116[0] = PVar6;
  auVar235 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar6 * 0x10 + 6));
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar6 * 0x10 + uVar78 * -2 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar192));
  auVar11._4_4_ = auVar92._4_4_ * auVar3._4_4_;
  auVar11._0_4_ = auVar92._0_4_ * auVar3._0_4_;
  auVar11._8_4_ = auVar92._8_4_ * auVar3._8_4_;
  auVar11._12_4_ = auVar92._12_4_ * auVar3._12_4_;
  auVar11._16_4_ = auVar92._16_4_ * 0.0;
  auVar11._20_4_ = auVar92._20_4_ * 0.0;
  auVar11._24_4_ = auVar92._24_4_ * 0.0;
  auVar11._28_4_ = auVar92._28_4_;
  auVar92 = vcvtdq2ps_avx(auVar235);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar192));
  auVar12._4_4_ = auVar3._4_4_ * auVar92._4_4_;
  auVar12._0_4_ = auVar3._0_4_ * auVar92._0_4_;
  auVar12._8_4_ = auVar3._8_4_ * auVar92._8_4_;
  auVar12._12_4_ = auVar3._12_4_ * auVar92._12_4_;
  auVar12._16_4_ = auVar92._16_4_ * 0.0;
  auVar12._20_4_ = auVar92._20_4_ * 0.0;
  auVar12._24_4_ = auVar92._24_4_ * 0.0;
  auVar12._28_4_ = auVar92._28_4_;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 + uVar78 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar132));
  auVar13._4_4_ = auVar92._4_4_ * auVar171._4_4_;
  auVar13._0_4_ = auVar92._0_4_ * auVar171._0_4_;
  auVar13._8_4_ = auVar92._8_4_ * auVar171._8_4_;
  auVar13._12_4_ = auVar92._12_4_ * auVar171._12_4_;
  auVar13._16_4_ = auVar92._16_4_ * 0.0;
  auVar13._20_4_ = auVar92._20_4_ * 0.0;
  auVar13._24_4_ = auVar92._24_4_ * 0.0;
  auVar13._28_4_ = auVar92._28_4_;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x17 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar132));
  auVar14._4_4_ = auVar171._4_4_ * auVar92._4_4_;
  auVar14._0_4_ = auVar171._0_4_ * auVar92._0_4_;
  auVar14._8_4_ = auVar171._8_4_ * auVar92._8_4_;
  auVar14._12_4_ = auVar171._12_4_ * auVar92._12_4_;
  auVar14._16_4_ = auVar92._16_4_ * 0.0;
  auVar14._20_4_ = auVar92._20_4_ * 0.0;
  auVar14._24_4_ = auVar92._24_4_ * 0.0;
  auVar14._28_4_ = auVar92._28_4_;
  auVar92 = vpminsd_avx2(auVar138,auVar10);
  auVar235 = vpminsd_avx2(auVar11,auVar12);
  auVar92 = vmaxps_avx(auVar92,auVar235);
  uVar186 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar213._4_4_ = uVar186;
  auVar213._0_4_ = uVar186;
  auVar213._8_4_ = uVar186;
  auVar213._12_4_ = uVar186;
  auVar213._16_4_ = uVar186;
  auVar213._20_4_ = uVar186;
  auVar213._24_4_ = uVar186;
  auVar213._28_4_ = uVar186;
  auVar235 = vpminsd_avx2(auVar13,auVar14);
  auVar235 = vmaxps_avx(auVar235,auVar213);
  auVar92 = vmaxps_avx(auVar92,auVar235);
  local_320._4_4_ = auVar92._4_4_ * 0.99999964;
  local_320._0_4_ = auVar92._0_4_ * 0.99999964;
  local_320._8_4_ = auVar92._8_4_ * 0.99999964;
  local_320._12_4_ = auVar92._12_4_ * 0.99999964;
  local_320._16_4_ = auVar92._16_4_ * 0.99999964;
  local_320._20_4_ = auVar92._20_4_ * 0.99999964;
  local_320._24_4_ = auVar92._24_4_ * 0.99999964;
  local_320._28_4_ = auVar235._28_4_;
  auVar92 = vpmaxsd_avx2(auVar138,auVar10);
  auVar235 = vpmaxsd_avx2(auVar11,auVar12);
  auVar92 = vminps_avx(auVar92,auVar235);
  auVar235 = vpmaxsd_avx2(auVar13,auVar14);
  fVar103 = (ray->super_RayK<1>).tfar;
  auVar134._4_4_ = fVar103;
  auVar134._0_4_ = fVar103;
  auVar134._8_4_ = fVar103;
  auVar134._12_4_ = fVar103;
  auVar134._16_4_ = fVar103;
  auVar134._20_4_ = fVar103;
  auVar134._24_4_ = fVar103;
  auVar134._28_4_ = fVar103;
  auVar235 = vminps_avx(auVar235,auVar134);
  auVar92 = vminps_avx(auVar92,auVar235);
  auVar160._4_4_ = auVar92._4_4_ * 1.0000004;
  auVar160._0_4_ = auVar92._0_4_ * 1.0000004;
  auVar160._8_4_ = auVar92._8_4_ * 1.0000004;
  auVar160._12_4_ = auVar92._12_4_ * 1.0000004;
  auVar160._16_4_ = auVar92._16_4_ * 1.0000004;
  auVar160._20_4_ = auVar92._20_4_ * 1.0000004;
  auVar160._24_4_ = auVar92._24_4_ * 1.0000004;
  auVar160._28_4_ = auVar92._28_4_;
  auVar116[4] = PVar6;
  auVar116._5_3_ = 0;
  auVar116[8] = PVar6;
  auVar116._9_3_ = 0;
  auVar116[0xc] = PVar6;
  auVar116._13_3_ = 0;
  auVar116[0x10] = PVar6;
  auVar116._17_3_ = 0;
  auVar116[0x14] = PVar6;
  auVar116._21_3_ = 0;
  auVar116[0x18] = PVar6;
  auVar116._25_3_ = 0;
  auVar116[0x1c] = PVar6;
  auVar116._29_3_ = 0;
  auVar235 = vpcmpgtd_avx2(auVar116,_DAT_01fe9900);
  auVar92 = vcmpps_avx(local_320,auVar160,2);
  auVar92 = vandps_avx(auVar92,auVar235);
  uVar73 = vmovmskps_avx(auVar92);
  if (uVar73 == 0) {
    return;
  }
  uVar73 = uVar73 & 0xff;
  auVar92._16_16_ = mm_lookupmask_ps._240_16_;
  auVar92._0_16_ = mm_lookupmask_ps._240_16_;
  local_380 = vblendps_avx(auVar92,ZEXT832(0) << 0x20,0x80);
  local_540 = 0x80000000;
  uStack_53c = 0x80000000;
  uStack_538 = 0x80000000;
  uStack_534 = 0x80000000;
  fStack_530 = -0.0;
  fStack_52c = -0.0;
  fStack_528 = -0.0;
  uStack_524 = 0x80000000;
  local_768 = prim;
LAB_0175ca14:
  lVar74 = 0;
  uVar76 = (ulong)uVar73;
  for (uVar78 = uVar76; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
    lVar74 = lVar74 + 1;
  }
  uVar76 = uVar76 - 1 & uVar76;
  uVar186 = *(undefined4 *)(local_768 + lVar74 * 4 + 6);
  uVar78 = (ulong)(uint)((int)lVar74 << 6);
  auVar85 = *(undefined1 (*) [16])(prim + uVar78 + lVar60 + 0x16);
  if (uVar76 != 0) {
    uVar75 = uVar76 - 1 & uVar76;
    for (uVar16 = uVar76; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
    }
    if (uVar75 != 0) {
      for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar3 = *(undefined1 (*) [16])(prim + uVar78 + lVar60 + 0x26);
  auVar171 = *(undefined1 (*) [16])(prim + uVar78 + lVar60 + 0x36);
  auVar132 = *(undefined1 (*) [16])(prim + uVar78 + lVar60 + 0x46);
  auVar187._0_4_ = (auVar85._0_4_ + auVar3._0_4_ + auVar171._0_4_ + auVar132._0_4_) * 0.25;
  auVar187._4_4_ = (auVar85._4_4_ + auVar3._4_4_ + auVar171._4_4_ + auVar132._4_4_) * 0.25;
  auVar187._8_4_ = (auVar85._8_4_ + auVar3._8_4_ + auVar171._8_4_ + auVar132._8_4_) * 0.25;
  auVar187._12_4_ = (auVar85._12_4_ + auVar3._12_4_ + auVar171._12_4_ + auVar132._12_4_) * 0.25;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar192 = vsubps_avx(auVar187,(undefined1  [16])aVar1);
  auVar192 = vdpps_avx(auVar192,(undefined1  [16])aVar2,0x7f);
  auVar89 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  uVar73 = *(uint *)(local_768 + 2);
  auVar211 = vrcpss_avx(auVar89,auVar89);
  auVar89 = vfnmadd213ss_fma(auVar211,auVar89,ZEXT416(0x40000000));
  fVar103 = auVar211._0_4_ * auVar89._0_4_;
  auVar216 = ZEXT464((uint)fVar103);
  fVar103 = auVar192._0_4_ * fVar103;
  local_780 = ZEXT416((uint)fVar103);
  auVar188._4_4_ = fVar103;
  auVar188._0_4_ = fVar103;
  auVar188._8_4_ = fVar103;
  auVar188._12_4_ = fVar103;
  fStack_7d0 = fVar103;
  _local_7e0 = auVar188;
  fStack_7cc = fVar103;
  fStack_7c8 = fVar103;
  fStack_7c4 = fVar103;
  auVar192 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar188);
  auVar192 = vblendps_avx(auVar192,_DAT_01f7aa10,8);
  local_950 = vsubps_avx(auVar85,auVar192);
  local_960 = vsubps_avx(auVar171,auVar192);
  local_970 = vsubps_avx(auVar3,auVar192);
  _local_980 = vsubps_avx(auVar132,auVar192);
  auVar85 = vmovshdup_avx(local_950);
  local_1e0 = auVar85._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar85 = vshufps_avx(local_950,local_950,0xaa);
  uVar80 = auVar85._0_8_;
  local_9a0._8_8_ = uVar80;
  local_9a0._0_8_ = uVar80;
  local_9a0._16_8_ = uVar80;
  local_9a0._24_8_ = uVar80;
  auVar244 = ZEXT3264(local_9a0);
  auVar85 = vshufps_avx(local_950,local_950,0xff);
  uVar80 = auVar85._0_8_;
  local_9c0._8_8_ = uVar80;
  local_9c0._0_8_ = uVar80;
  local_9c0._16_8_ = uVar80;
  local_9c0._24_8_ = uVar80;
  auVar252 = ZEXT3264(local_9c0);
  auVar85 = vmovshdup_avx(local_970);
  local_200 = auVar85._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar85 = vshufps_avx(local_970,local_970,0xaa);
  local_220 = auVar85._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar85 = vshufps_avx(local_970,local_970,0xff);
  uVar80 = auVar85._0_8_;
  local_9e0._8_8_ = uVar80;
  local_9e0._0_8_ = uVar80;
  local_9e0._16_8_ = uVar80;
  local_9e0._24_8_ = uVar80;
  auVar258 = ZEXT3264(local_9e0);
  auVar85 = vmovshdup_avx(local_960);
  local_340 = auVar85._0_4_;
  fStack_33c = auVar85._4_4_;
  auVar85 = vshufps_avx(local_960,local_960,0xaa);
  local_240 = auVar85._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar85 = vshufps_avx(local_960,local_960,0xff);
  local_360 = auVar85._0_4_;
  fStack_35c = auVar85._4_4_;
  auVar85 = vmovshdup_avx(_local_980);
  local_260 = auVar85._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar85 = vshufps_avx(_local_980,_local_980,0xaa);
  local_280 = auVar85._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar85 = vshufps_avx(_local_980,_local_980,0xff);
  local_2a0 = auVar85._0_8_;
  uStack_298 = local_2a0;
  uStack_290 = local_2a0;
  uStack_288 = local_2a0;
  auVar82._0_4_ = aVar2.x * aVar2.x;
  auVar82._4_4_ = aVar2.y * aVar2.y;
  auVar82._8_4_ = aVar2.z * aVar2.z;
  auVar82._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar85 = vshufps_avx(auVar82,auVar82,0xaa);
  uVar80 = auVar85._0_8_;
  auVar235._8_8_ = uVar80;
  auVar235._0_8_ = uVar80;
  auVar235._16_8_ = uVar80;
  auVar235._24_8_ = uVar80;
  uVar79 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_680._4_4_ = uVar79;
  local_680._0_4_ = uVar79;
  fStack_678 = (float)uVar79;
  fStack_674 = (float)uVar79;
  fStack_670 = (float)uVar79;
  fStack_66c = (float)uVar79;
  fStack_668 = (float)uVar79;
  register0x0000125c = uVar79;
  uVar79 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_6a0._4_4_ = uVar79;
  local_6a0._0_4_ = uVar79;
  fStack_698 = (float)uVar79;
  fStack_694 = (float)uVar79;
  fStack_690 = (float)uVar79;
  fStack_68c = (float)uVar79;
  fStack_688 = (float)uVar79;
  register0x0000149c = uVar79;
  auVar228 = ZEXT3264(_local_6a0);
  auVar85 = vfmadd231ps_fma(auVar235,_local_6a0,_local_6a0);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),_local_680,_local_680);
  auVar239 = ZEXT1664(auVar85);
  local_aec = 1;
  uVar78 = 0;
  local_6c0 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_6bc = local_6c0;
  fStack_6b8 = local_6c0;
  fStack_6b4 = local_6c0;
  fStack_6b0 = local_6c0;
  fStack_6ac = local_6c0;
  fStack_6a8 = local_6c0;
  fStack_6a4 = local_6c0;
  uVar79 = local_950._0_4_;
  local_940._4_4_ = uVar79;
  local_940._0_4_ = uVar79;
  local_940._8_4_ = uVar79;
  local_940._12_4_ = uVar79;
  local_940._16_4_ = uVar79;
  local_940._20_4_ = uVar79;
  local_940._24_4_ = uVar79;
  local_940._28_4_ = uVar79;
  auVar222 = ZEXT3264(local_940);
  uVar79 = local_970._0_4_;
  local_a00._4_4_ = uVar79;
  local_a00._0_4_ = uVar79;
  local_a00._8_4_ = uVar79;
  local_a00._12_4_ = uVar79;
  local_a00._16_4_ = uVar79;
  local_a00._20_4_ = uVar79;
  local_a00._24_4_ = uVar79;
  local_a00._28_4_ = uVar79;
  auVar225 = ZEXT3264(local_a00);
  uVar79 = local_960._0_4_;
  local_300._4_4_ = uVar79;
  local_300._0_4_ = uVar79;
  local_300._8_4_ = uVar79;
  local_300._12_4_ = uVar79;
  local_300._16_4_ = uVar79;
  local_300._20_4_ = uVar79;
  local_300._24_4_ = uVar79;
  local_300._28_4_ = uVar79;
  local_2e0 = local_980._0_4_;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_3a0 = vandps_avx(ZEXT1632(auVar85),local_720);
  local_430 = ZEXT816(0x3f80000000000000);
  local_2c0 = ZEXT1632(auVar85);
  fStack_358 = local_360;
  fStack_354 = fStack_35c;
  fStack_350 = local_360;
  fStack_34c = fStack_35c;
  fStack_348 = local_360;
  fStack_344 = fStack_35c;
  fStack_338 = local_340;
  fStack_334 = fStack_33c;
  fStack_330 = local_340;
  fStack_32c = fStack_33c;
  fStack_328 = local_340;
  fStack_324 = fStack_33c;
  do {
    auVar157._8_4_ = 0x3f800000;
    auVar157._0_8_ = 0x3f8000003f800000;
    auVar157._12_4_ = 0x3f800000;
    auVar157._16_4_ = 0x3f800000;
    auVar157._20_4_ = 0x3f800000;
    iVar77 = (int)uVar78;
    auVar157._24_4_ = 0x3f800000;
    auVar157._28_4_ = 0x3f800000;
    auVar85 = vmovshdup_avx(local_430);
    auVar85 = vsubps_avx(auVar85,local_430);
    fVar126 = auVar85._0_4_;
    fVar128 = fVar126 * 0.04761905;
    local_700._0_4_ = local_430._0_4_;
    local_700._4_4_ = local_700._0_4_;
    local_700._8_4_ = local_700._0_4_;
    local_700._12_4_ = local_700._0_4_;
    local_700._16_4_ = local_700._0_4_;
    local_700._20_4_ = local_700._0_4_;
    local_700._24_4_ = local_700._0_4_;
    local_700._28_4_ = local_700._0_4_;
    local_620._4_4_ = fVar126;
    local_620._0_4_ = fVar126;
    local_620._8_4_ = fVar126;
    local_620._12_4_ = fVar126;
    local_620._16_4_ = fVar126;
    local_620._20_4_ = fVar126;
    local_620._24_4_ = fVar126;
    local_620._28_4_ = fVar126;
    auVar85 = vfmadd231ps_fma(local_700,local_620,_DAT_01faff20);
    auVar92 = vsubps_avx(auVar157,ZEXT1632(auVar85));
    fVar103 = auVar85._0_4_;
    auVar240._0_4_ = auVar225._0_4_ * fVar103;
    fVar123 = auVar85._4_4_;
    auVar240._4_4_ = auVar225._4_4_ * fVar123;
    fVar124 = auVar85._8_4_;
    auVar240._8_4_ = auVar225._8_4_ * fVar124;
    fVar125 = auVar85._12_4_;
    auVar240._12_4_ = auVar225._12_4_ * fVar125;
    auVar240._16_4_ = auVar225._16_4_ * 0.0;
    auVar240._20_4_ = auVar225._20_4_ * 0.0;
    auVar240._28_36_ = auVar239._28_36_;
    auVar240._24_4_ = auVar225._24_4_ * 0.0;
    auVar66._8_8_ = uStack_1f8;
    auVar66._0_8_ = local_200;
    auVar66._16_8_ = uStack_1f0;
    auVar66._24_8_ = uStack_1e8;
    auVar121._0_4_ = (float)local_200 * fVar103;
    auVar121._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar123;
    auVar121._8_4_ = (float)uStack_1f8 * fVar124;
    auVar121._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar125;
    auVar121._16_4_ = (float)uStack_1f0 * 0.0;
    auVar121._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar121._28_36_ = auVar228._28_36_;
    auVar121._24_4_ = (float)uStack_1e8 * 0.0;
    auVar65._8_8_ = uStack_218;
    auVar65._0_8_ = local_220;
    auVar65._16_8_ = uStack_210;
    auVar65._24_8_ = uStack_208;
    auVar228._0_4_ = (float)local_220 * fVar103;
    auVar228._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar123;
    auVar228._8_4_ = (float)uStack_218 * fVar124;
    auVar228._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar125;
    auVar228._16_4_ = (float)uStack_210 * 0.0;
    auVar228._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar228._28_36_ = auVar216._28_36_;
    auVar228._24_4_ = (float)uStack_208 * 0.0;
    auVar17._4_4_ = auVar258._4_4_ * fVar123;
    auVar17._0_4_ = auVar258._0_4_ * fVar103;
    auVar17._8_4_ = auVar258._8_4_ * fVar124;
    auVar17._12_4_ = auVar258._12_4_ * fVar125;
    auVar17._16_4_ = auVar258._16_4_ * 0.0;
    auVar17._20_4_ = auVar258._20_4_ * 0.0;
    auVar17._24_4_ = auVar258._24_4_ * 0.0;
    auVar17._28_4_ = fVar126;
    auVar85 = vfmadd231ps_fma(auVar240._0_32_,auVar92,auVar222._0_32_);
    auVar67._8_8_ = uStack_1d8;
    auVar67._0_8_ = local_1e0;
    auVar67._16_8_ = uStack_1d0;
    auVar67._24_8_ = uStack_1c8;
    auVar3 = vfmadd231ps_fma(auVar121._0_32_,auVar92,auVar67);
    auVar171 = vfmadd231ps_fma(auVar228._0_32_,auVar92,auVar244._0_32_);
    auVar132 = vfmadd231ps_fma(auVar17,auVar92,auVar252._0_32_);
    auVar239._0_4_ = local_300._0_4_ * fVar103;
    auVar239._4_4_ = local_300._4_4_ * fVar123;
    auVar239._8_4_ = local_300._8_4_ * fVar124;
    auVar239._12_4_ = local_300._12_4_ * fVar125;
    auVar239._16_4_ = local_300._16_4_ * 0.0;
    auVar239._20_4_ = local_300._20_4_ * 0.0;
    auVar239._28_36_ = auVar222._28_36_;
    auVar239._24_4_ = local_300._24_4_ * 0.0;
    auVar18._4_4_ = fVar123 * fStack_33c;
    auVar18._0_4_ = fVar103 * local_340;
    auVar18._8_4_ = fVar124 * fStack_338;
    auVar18._12_4_ = fVar125 * fStack_334;
    auVar18._16_4_ = fStack_330 * 0.0;
    auVar18._20_4_ = fStack_32c * 0.0;
    auVar18._24_4_ = fStack_328 * 0.0;
    auVar18._28_4_ = local_300._28_4_;
    auVar64._8_8_ = uStack_238;
    auVar64._0_8_ = local_240;
    auVar64._16_8_ = uStack_230;
    auVar64._24_8_ = uStack_228;
    auVar69._4_4_ = (float)((ulong)local_240 >> 0x20) * fVar123;
    auVar69._0_4_ = (float)local_240 * fVar103;
    auVar69._8_4_ = (float)uStack_238 * fVar124;
    auVar69._12_4_ = (float)((ulong)uStack_238 >> 0x20) * fVar125;
    auVar69._16_4_ = (float)uStack_230 * 0.0;
    auVar69._20_4_ = (float)((ulong)uStack_230 >> 0x20) * 0.0;
    auVar69._24_4_ = (float)uStack_228 * 0.0;
    auVar69._28_4_ = DAT_01faff20._28_4_;
    auVar19._4_4_ = fVar123 * fStack_35c;
    auVar19._0_4_ = fVar103 * local_360;
    auVar19._8_4_ = fVar124 * fStack_358;
    auVar19._12_4_ = fVar125 * fStack_354;
    auVar19._16_4_ = fStack_350 * 0.0;
    auVar19._20_4_ = fStack_34c * 0.0;
    uVar79 = (undefined4)((ulong)uStack_208 >> 0x20);
    auVar19._24_4_ = fStack_348 * 0.0;
    auVar19._28_4_ = uVar79;
    auVar192 = vfmadd231ps_fma(auVar239._0_32_,auVar92,auVar225._0_32_);
    auVar89 = vfmadd231ps_fma(auVar18,auVar92,auVar66);
    auVar211 = vfmadd231ps_fma(auVar69,auVar92,auVar65);
    auVar4 = vfmadd231ps_fma(auVar19,auVar92,auVar258._0_32_);
    auVar20._4_4_ = fVar123 * fStack_2dc;
    auVar20._0_4_ = fVar103 * local_2e0;
    auVar20._8_4_ = fVar124 * fStack_2d8;
    auVar20._12_4_ = fVar125 * fStack_2d4;
    auVar20._16_4_ = fStack_2d0 * 0.0;
    auVar20._20_4_ = fStack_2cc * 0.0;
    auVar20._24_4_ = fStack_2c8 * 0.0;
    auVar20._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    auVar21._4_4_ = fVar123 * local_260._4_4_;
    auVar21._0_4_ = fVar103 * (float)local_260;
    auVar21._8_4_ = fVar124 * (float)uStack_258;
    auVar21._12_4_ = fVar125 * uStack_258._4_4_;
    auVar21._16_4_ = (float)uStack_250 * 0.0;
    auVar21._20_4_ = uStack_250._4_4_ * 0.0;
    auVar21._24_4_ = (float)uStack_248 * 0.0;
    auVar21._28_4_ = uVar79;
    auVar22._28_4_ = auVar258._28_4_;
    auVar22._0_28_ =
         ZEXT1628(CONCAT412(auVar192._12_4_ * fVar125,
                            CONCAT48(auVar192._8_4_ * fVar124,
                                     CONCAT44(auVar192._4_4_ * fVar123,auVar192._0_4_ * fVar103))));
    auVar85 = vfmadd231ps_fma(auVar22,auVar92,ZEXT1632(auVar85));
    auVar3 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar125 * auVar89._12_4_,
                                                CONCAT48(fVar124 * auVar89._8_4_,
                                                         CONCAT44(fVar123 * auVar89._4_4_,
                                                                  fVar103 * auVar89._0_4_)))),
                             auVar92,ZEXT1632(auVar3));
    auVar171 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar125 * auVar211._12_4_,
                                                  CONCAT48(fVar124 * auVar211._8_4_,
                                                           CONCAT44(fVar123 * auVar211._4_4_,
                                                                    fVar103 * auVar211._0_4_)))),
                               auVar92,ZEXT1632(auVar171));
    auVar225._0_28_ =
         ZEXT1628(CONCAT412(fVar125 * auVar4._12_4_,
                            CONCAT48(fVar124 * auVar4._8_4_,
                                     CONCAT44(fVar123 * auVar4._4_4_,fVar103 * auVar4._0_4_))));
    auVar132 = vfmadd231ps_fma(auVar225._0_32_,auVar92,ZEXT1632(auVar132));
    auVar214._0_4_ = fVar103 * (float)local_280;
    auVar214._4_4_ = fVar123 * local_280._4_4_;
    auVar214._8_4_ = fVar124 * (float)uStack_278;
    auVar214._12_4_ = fVar125 * uStack_278._4_4_;
    auVar214._16_4_ = (float)uStack_270 * 0.0;
    auVar214._20_4_ = uStack_270._4_4_ * 0.0;
    auVar214._24_4_ = (float)uStack_268 * 0.0;
    auVar214._28_4_ = 0;
    auVar5 = vfmadd231ps_fma(auVar20,auVar92,local_300);
    auVar192 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar5._12_4_ * fVar125,
                                                  CONCAT48(auVar5._8_4_ * fVar124,
                                                           CONCAT44(auVar5._4_4_ * fVar123,
                                                                    auVar5._0_4_ * fVar103)))),
                               auVar92,ZEXT1632(auVar192));
    auVar218._0_4_ = fVar103 * (float)local_2a0;
    auVar218._4_4_ = fVar123 * local_2a0._4_4_;
    auVar218._8_4_ = fVar124 * (float)uStack_298;
    auVar218._12_4_ = fVar125 * uStack_298._4_4_;
    auVar218._16_4_ = (float)uStack_290 * 0.0;
    auVar218._20_4_ = uStack_290._4_4_ * 0.0;
    auVar218._24_4_ = (float)uStack_288 * 0.0;
    auVar218._28_4_ = 0;
    auVar63._4_4_ = fStack_33c;
    auVar63._0_4_ = local_340;
    auVar63._8_4_ = fStack_338;
    auVar63._12_4_ = fStack_334;
    auVar63._16_4_ = fStack_330;
    auVar63._20_4_ = fStack_32c;
    auVar63._24_4_ = fStack_328;
    auVar63._28_4_ = fStack_324;
    auVar5 = vfmadd231ps_fma(auVar21,auVar92,auVar63);
    auVar81 = vfmadd231ps_fma(auVar214,auVar92,auVar64);
    auVar62._4_4_ = fStack_35c;
    auVar62._0_4_ = local_360;
    auVar62._8_4_ = fStack_358;
    auVar62._12_4_ = fStack_354;
    auVar62._16_4_ = fStack_350;
    auVar62._20_4_ = fStack_34c;
    auVar62._24_4_ = fStack_348;
    auVar62._28_4_ = fStack_344;
    auVar209 = vfmadd231ps_fma(auVar218,auVar92,auVar62);
    auVar23._28_4_ = local_300._28_4_;
    auVar23._0_28_ =
         ZEXT1628(CONCAT412(auVar209._12_4_ * fVar125,
                            CONCAT48(auVar209._8_4_ * fVar124,
                                     CONCAT44(auVar209._4_4_ * fVar123,auVar209._0_4_ * fVar103))));
    auVar89 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar5._12_4_ * fVar125,
                                                 CONCAT48(auVar5._8_4_ * fVar124,
                                                          CONCAT44(auVar5._4_4_ * fVar123,
                                                                   auVar5._0_4_ * fVar103)))),
                              auVar92,ZEXT1632(auVar89));
    auVar211 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar125 * auVar81._12_4_,
                                                  CONCAT48(fVar124 * auVar81._8_4_,
                                                           CONCAT44(fVar123 * auVar81._4_4_,
                                                                    fVar103 * auVar81._0_4_)))),
                               auVar92,ZEXT1632(auVar211));
    auVar4 = vfmadd231ps_fma(auVar23,auVar92,ZEXT1632(auVar4));
    auVar24._28_4_ = (int)((ulong)uStack_228 >> 0x20);
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar125 * auVar211._12_4_,
                            CONCAT48(fVar124 * auVar211._8_4_,
                                     CONCAT44(fVar123 * auVar211._4_4_,fVar103 * auVar211._0_4_))));
    auVar5 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar192._12_4_ * fVar125,
                                                CONCAT48(auVar192._8_4_ * fVar124,
                                                         CONCAT44(auVar192._4_4_ * fVar123,
                                                                  auVar192._0_4_ * fVar103)))),
                             auVar92,ZEXT1632(auVar85));
    auVar81 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar89._12_4_ * fVar125,
                                                 CONCAT48(auVar89._8_4_ * fVar124,
                                                          CONCAT44(auVar89._4_4_ * fVar123,
                                                                   auVar89._0_4_ * fVar103)))),
                              auVar92,ZEXT1632(auVar3));
    auVar137 = ZEXT1632(auVar81);
    auVar81 = vfmadd231ps_fma(auVar24,auVar92,ZEXT1632(auVar171));
    auVar209 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar4._12_4_ * fVar125,
                                                  CONCAT48(auVar4._8_4_ * fVar124,
                                                           CONCAT44(auVar4._4_4_ * fVar123,
                                                                    auVar4._0_4_ * fVar103)))),
                               ZEXT1632(auVar132),auVar92);
    auVar235 = vsubps_avx(ZEXT1632(auVar192),ZEXT1632(auVar85));
    auVar92 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar3));
    auVar9 = vsubps_avx(ZEXT1632(auVar211),ZEXT1632(auVar171));
    auVar138 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar132));
    fVar185 = fVar128 * auVar235._0_4_ * 3.0;
    fVar198 = fVar128 * auVar235._4_4_ * 3.0;
    local_7c0._4_4_ = fVar198;
    local_7c0._0_4_ = fVar185;
    fVar199 = fVar128 * auVar235._8_4_ * 3.0;
    local_7c0._8_4_ = fVar199;
    fVar200 = fVar128 * auVar235._12_4_ * 3.0;
    local_7c0._12_4_ = fVar200;
    fVar201 = fVar128 * auVar235._16_4_ * 3.0;
    local_7c0._16_4_ = fVar201;
    fVar202 = fVar128 * auVar235._20_4_ * 3.0;
    local_7c0._20_4_ = fVar202;
    fVar203 = fVar128 * auVar235._24_4_ * 3.0;
    local_7c0._24_4_ = fVar203;
    local_7c0._28_4_ = 0x40400000;
    local_920._0_4_ = fVar128 * auVar92._0_4_ * 3.0;
    local_920._4_4_ = fVar128 * auVar92._4_4_ * 3.0;
    local_920._8_4_ = fVar128 * auVar92._8_4_ * 3.0;
    local_920._12_4_ = fVar128 * auVar92._12_4_ * 3.0;
    local_920._16_4_ = fVar128 * auVar92._16_4_ * 3.0;
    local_920._20_4_ = fVar128 * auVar92._20_4_ * 3.0;
    local_920._24_4_ = fVar128 * auVar92._24_4_ * 3.0;
    local_920._28_4_ = 0;
    local_600._0_4_ = fVar128 * auVar9._0_4_ * 3.0;
    local_600._4_4_ = fVar128 * auVar9._4_4_ * 3.0;
    local_600._8_4_ = fVar128 * auVar9._8_4_ * 3.0;
    local_600._12_4_ = fVar128 * auVar9._12_4_ * 3.0;
    local_600._16_4_ = fVar128 * auVar9._16_4_ * 3.0;
    local_600._20_4_ = fVar128 * auVar9._20_4_ * 3.0;
    local_600._24_4_ = fVar128 * auVar9._24_4_ * 3.0;
    local_600._28_4_ = 0;
    fVar103 = fVar128 * auVar138._0_4_ * 3.0;
    fVar123 = fVar128 * auVar138._4_4_ * 3.0;
    auVar25._4_4_ = fVar123;
    auVar25._0_4_ = fVar103;
    fVar124 = fVar128 * auVar138._8_4_ * 3.0;
    auVar25._8_4_ = fVar124;
    fVar125 = fVar128 * auVar138._12_4_ * 3.0;
    auVar25._12_4_ = fVar125;
    fVar126 = fVar128 * auVar138._16_4_ * 3.0;
    auVar25._16_4_ = fVar126;
    fVar127 = fVar128 * auVar138._20_4_ * 3.0;
    auVar25._20_4_ = fVar127;
    fVar128 = fVar128 * auVar138._24_4_ * 3.0;
    auVar25._24_4_ = fVar128;
    auVar25._28_4_ = auVar235._28_4_;
    auVar160 = ZEXT1632(auVar5);
    auVar10 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar5));
    local_8a0 = vpermps_avx2(_DAT_01fec480,auVar137);
    _local_7a0 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar81));
    _local_5c0 = vsubps_avx(auVar10,auVar160);
    local_4a0 = vsubps_avx(_local_7a0,ZEXT1632(auVar81));
    fVar165 = local_4a0._0_4_;
    fVar166 = local_4a0._4_4_;
    auVar26._4_4_ = fVar166 * fVar198;
    auVar26._0_4_ = fVar165 * fVar185;
    fVar185 = local_4a0._8_4_;
    auVar26._8_4_ = fVar185 * fVar199;
    fVar198 = local_4a0._12_4_;
    auVar26._12_4_ = fVar198 * fVar200;
    fVar199 = local_4a0._16_4_;
    auVar26._16_4_ = fVar199 * fVar201;
    fVar200 = local_4a0._20_4_;
    auVar26._20_4_ = fVar200 * fVar202;
    fVar201 = local_4a0._24_4_;
    auVar26._24_4_ = fVar201 * fVar203;
    auVar26._28_4_ = auVar10._28_4_;
    auVar85 = vfmsub231ps_fma(auVar26,local_600,_local_5c0);
    local_4c0 = vsubps_avx(local_8a0,auVar137);
    fVar226 = local_5c0._0_4_;
    fVar229 = local_5c0._4_4_;
    auVar27._4_4_ = fVar229 * local_920._4_4_;
    auVar27._0_4_ = fVar226 * local_920._0_4_;
    fVar230 = local_5c0._8_4_;
    auVar27._8_4_ = fVar230 * local_920._8_4_;
    fVar231 = local_5c0._12_4_;
    auVar27._12_4_ = fVar231 * local_920._12_4_;
    fVar232 = local_5c0._16_4_;
    auVar27._16_4_ = fVar232 * local_920._16_4_;
    fVar233 = local_5c0._20_4_;
    auVar27._20_4_ = fVar233 * local_920._20_4_;
    fVar234 = local_5c0._24_4_;
    auVar27._24_4_ = fVar234 * local_920._24_4_;
    auVar27._28_4_ = local_8a0._28_4_;
    auVar3 = vfmsub231ps_fma(auVar27,local_7c0,local_4c0);
    auVar28._28_4_ = local_7a0._28_4_;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(auVar3._12_4_ * auVar3._12_4_,
                            CONCAT48(auVar3._8_4_ * auVar3._8_4_,
                                     CONCAT44(auVar3._4_4_ * auVar3._4_4_,
                                              auVar3._0_4_ * auVar3._0_4_))));
    auVar85 = vfmadd231ps_fma(auVar28,ZEXT1632(auVar85),ZEXT1632(auVar85));
    fVar202 = local_4c0._0_4_;
    auVar93._0_4_ = fVar202 * local_600._0_4_;
    fVar203 = local_4c0._4_4_;
    auVar93._4_4_ = fVar203 * local_600._4_4_;
    fVar167 = local_4c0._8_4_;
    auVar93._8_4_ = fVar167 * local_600._8_4_;
    fVar168 = local_4c0._12_4_;
    auVar93._12_4_ = fVar168 * local_600._12_4_;
    fVar169 = local_4c0._16_4_;
    auVar93._16_4_ = fVar169 * local_600._16_4_;
    fVar241 = local_4c0._20_4_;
    auVar93._20_4_ = fVar241 * local_600._20_4_;
    fVar242 = local_4c0._24_4_;
    auVar93._24_4_ = fVar242 * local_600._24_4_;
    auVar93._28_4_ = 0;
    auVar171 = vfmsub231ps_fma(auVar93,local_920,local_4a0);
    auVar135._0_4_ = fVar165 * fVar165;
    auVar135._4_4_ = fVar166 * fVar166;
    auVar135._8_4_ = fVar185 * fVar185;
    auVar135._12_4_ = fVar198 * fVar198;
    auVar135._16_4_ = fVar199 * fVar199;
    auVar135._20_4_ = fVar200 * fVar200;
    auVar135._24_4_ = fVar201 * fVar201;
    auVar135._28_4_ = 0;
    auVar3 = vfmadd231ps_fma(auVar135,local_4c0,local_4c0);
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),_local_5c0,_local_5c0);
    auVar92 = vrcpps_avx(ZEXT1632(auVar3));
    auVar171 = vfmadd231ps_fma(ZEXT1632(auVar85),ZEXT1632(auVar171),ZEXT1632(auVar171));
    auVar245._8_4_ = 0x3f800000;
    auVar245._0_8_ = 0x3f8000003f800000;
    auVar245._12_4_ = 0x3f800000;
    auVar245._16_4_ = 0x3f800000;
    auVar245._20_4_ = 0x3f800000;
    auVar245._24_4_ = 0x3f800000;
    auVar245._28_4_ = 0x3f800000;
    auVar85 = vfnmadd213ps_fma(auVar92,ZEXT1632(auVar3),auVar245);
    auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar92,auVar92);
    local_a20 = vpermps_avx2(_DAT_01fec480,local_7c0);
    local_a40 = vpermps_avx2(_DAT_01fec480,local_600);
    auVar29._4_4_ = local_a20._4_4_ * fVar166;
    auVar29._0_4_ = local_a20._0_4_ * fVar165;
    auVar29._8_4_ = local_a20._8_4_ * fVar185;
    auVar29._12_4_ = local_a20._12_4_ * fVar198;
    auVar29._16_4_ = local_a20._16_4_ * fVar199;
    auVar29._20_4_ = local_a20._20_4_ * fVar200;
    auVar29._24_4_ = local_a20._24_4_ * fVar201;
    auVar29._28_4_ = auVar92._28_4_;
    auVar132 = vfmsub231ps_fma(auVar29,local_a40,_local_5c0);
    local_840 = vpermps_avx2(_DAT_01fec480,local_920);
    auVar30._4_4_ = fVar229 * local_840._4_4_;
    auVar30._0_4_ = fVar226 * local_840._0_4_;
    auVar30._8_4_ = fVar230 * local_840._8_4_;
    auVar30._12_4_ = fVar231 * local_840._12_4_;
    auVar30._16_4_ = fVar232 * local_840._16_4_;
    auVar30._20_4_ = fVar233 * local_840._20_4_;
    auVar30._24_4_ = fVar234 * local_840._24_4_;
    auVar30._28_4_ = 0x40400000;
    auVar12 = local_a20;
    auVar192 = vfmsub231ps_fma(auVar30,local_a20,local_4c0);
    auVar132 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar192._12_4_ * auVar192._12_4_,
                                                  CONCAT48(auVar192._8_4_ * auVar192._8_4_,
                                                           CONCAT44(auVar192._4_4_ * auVar192._4_4_,
                                                                    auVar192._0_4_ * auVar192._0_4_)
                                                          ))),ZEXT1632(auVar132),ZEXT1632(auVar132))
    ;
    auVar11 = local_a40;
    auVar177._0_4_ = fVar202 * local_a40._0_4_;
    auVar177._4_4_ = fVar203 * local_a40._4_4_;
    auVar177._8_4_ = fVar167 * local_a40._8_4_;
    auVar177._12_4_ = fVar168 * local_a40._12_4_;
    auVar177._16_4_ = fVar169 * local_a40._16_4_;
    auVar177._20_4_ = fVar241 * local_a40._20_4_;
    auVar177._24_4_ = fVar242 * local_a40._24_4_;
    auVar177._28_4_ = 0;
    auVar13 = local_840;
    auVar192 = vfmsub231ps_fma(auVar177,local_840,local_4a0);
    auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),ZEXT1632(auVar192),ZEXT1632(auVar192));
    auVar92 = vmaxps_avx(ZEXT1632(CONCAT412(auVar171._12_4_ * auVar85._12_4_,
                                            CONCAT48(auVar171._8_4_ * auVar85._8_4_,
                                                     CONCAT44(auVar171._4_4_ * auVar85._4_4_,
                                                              auVar171._0_4_ * auVar85._0_4_)))),
                         ZEXT1632(CONCAT412(auVar132._12_4_ * auVar85._12_4_,
                                            CONCAT48(auVar132._8_4_ * auVar85._8_4_,
                                                     CONCAT44(auVar132._4_4_ * auVar85._4_4_,
                                                              auVar132._0_4_ * auVar85._0_4_)))));
    local_640._0_4_ = auVar209._0_4_ + fVar103;
    local_640._4_4_ = auVar209._4_4_ + fVar123;
    local_640._8_4_ = auVar209._8_4_ + fVar124;
    local_640._12_4_ = auVar209._12_4_ + fVar125;
    local_640._16_4_ = fVar126 + 0.0;
    local_640._20_4_ = fVar127 + 0.0;
    local_640._24_4_ = fVar128 + 0.0;
    local_640._28_4_ = auVar235._28_4_ + 0.0;
    _local_800 = ZEXT1632(auVar209);
    auVar235 = vsubps_avx(_local_800,auVar25);
    local_660 = vpermps_avx2(_DAT_01fec480,auVar235);
    local_820 = vpermps_avx2(_DAT_01fec480,_local_800);
    auVar235 = vmaxps_avx(_local_800,local_640);
    auVar14 = local_660;
    auVar9 = vmaxps_avx(local_660,local_820);
    auVar138 = vrsqrtps_avx(ZEXT1632(auVar3));
    auVar235 = vmaxps_avx(auVar235,auVar9);
    fVar103 = auVar138._0_4_;
    fVar123 = auVar138._4_4_;
    fVar124 = auVar138._8_4_;
    fVar125 = auVar138._12_4_;
    fVar128 = auVar138._16_4_;
    fVar126 = auVar138._20_4_;
    fVar127 = auVar138._24_4_;
    auVar31._4_4_ = fVar123 * fVar123 * fVar123 * auVar3._4_4_ * -0.5;
    auVar31._0_4_ = fVar103 * fVar103 * fVar103 * auVar3._0_4_ * -0.5;
    auVar31._8_4_ = fVar124 * fVar124 * fVar124 * auVar3._8_4_ * -0.5;
    auVar31._12_4_ = fVar125 * fVar125 * fVar125 * auVar3._12_4_ * -0.5;
    auVar31._16_4_ = fVar128 * fVar128 * fVar128 * -0.0;
    auVar31._20_4_ = fVar126 * fVar126 * fVar126 * -0.0;
    auVar31._24_4_ = fVar127 * fVar127 * fVar127 * -0.0;
    auVar31._28_4_ = 0;
    auVar94._8_4_ = 0x3fc00000;
    auVar94._0_8_ = 0x3fc000003fc00000;
    auVar94._12_4_ = 0x3fc00000;
    auVar94._16_4_ = 0x3fc00000;
    auVar94._20_4_ = 0x3fc00000;
    auVar94._24_4_ = 0x3fc00000;
    auVar94._28_4_ = 0x3fc00000;
    auVar85 = vfmadd231ps_fma(auVar31,auVar94,auVar138);
    fVar103 = auVar85._0_4_;
    fVar124 = auVar85._4_4_;
    auVar32._4_4_ = fVar203 * fVar124;
    auVar32._0_4_ = fVar202 * fVar103;
    fVar128 = auVar85._8_4_;
    auVar32._8_4_ = fVar167 * fVar128;
    fVar127 = auVar85._12_4_;
    auVar32._12_4_ = fVar168 * fVar127;
    auVar32._16_4_ = fVar169 * 0.0;
    auVar32._20_4_ = fVar241 * 0.0;
    auVar32._24_4_ = fVar242 * 0.0;
    auVar32._28_4_ = 0x3fc00000;
    auVar251._0_4_ = local_6c0 * fVar165 * fVar103;
    auVar251._4_4_ = fStack_6bc * fVar166 * fVar124;
    auVar251._8_4_ = fStack_6b8 * fVar185 * fVar128;
    auVar251._12_4_ = fStack_6b4 * fVar198 * fVar127;
    auVar251._16_4_ = fStack_6b0 * fVar199 * 0.0;
    auVar251._20_4_ = fStack_6ac * fVar200 * 0.0;
    auVar251._24_4_ = fStack_6a8 * fVar201 * 0.0;
    auVar251._28_4_ = 0;
    auVar85 = vfmadd231ps_fma(auVar251,auVar32,_local_6a0);
    local_480 = ZEXT1632(auVar81);
    local_860 = vsubps_avx(ZEXT832(0) << 0x20,local_480);
    fVar202 = local_860._0_4_;
    fVar203 = local_860._4_4_;
    auVar33._4_4_ = fVar203 * fVar166 * fVar124;
    auVar33._0_4_ = fVar202 * fVar165 * fVar103;
    fVar165 = local_860._8_4_;
    auVar33._8_4_ = fVar165 * fVar185 * fVar128;
    fVar166 = local_860._12_4_;
    auVar33._12_4_ = fVar166 * fVar198 * fVar127;
    fVar167 = local_860._16_4_;
    auVar33._16_4_ = fVar167 * fVar199 * 0.0;
    fVar168 = local_860._20_4_;
    auVar33._20_4_ = fVar168 * fVar200 * 0.0;
    fVar169 = local_860._24_4_;
    auVar33._24_4_ = fVar169 * fVar201 * 0.0;
    auVar33._28_4_ = local_4a0._28_4_;
    auVar9 = vsubps_avx(ZEXT832(0) << 0x20,auVar137);
    auVar3 = vfmadd231ps_fma(auVar33,auVar9,auVar32);
    auVar34._4_4_ = fVar229 * fVar124;
    auVar34._0_4_ = fVar226 * fVar103;
    auVar34._8_4_ = fVar230 * fVar128;
    auVar34._12_4_ = fVar231 * fVar127;
    auVar34._16_4_ = fVar232 * 0.0;
    auVar34._20_4_ = fVar233 * 0.0;
    auVar34._24_4_ = fVar234 * 0.0;
    auVar34._28_4_ = 0x3fc00000;
    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar34,_local_680);
    auVar237 = vsubps_avx(ZEXT832(0) << 0x20,auVar160);
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar237,auVar34);
    auVar216 = ZEXT1664(auVar3);
    auVar35._4_4_ = fStack_6bc * fVar203;
    auVar35._0_4_ = local_6c0 * fVar202;
    auVar35._8_4_ = fStack_6b8 * fVar165;
    auVar35._12_4_ = fStack_6b4 * fVar166;
    auVar35._16_4_ = fStack_6b0 * fVar167;
    auVar35._20_4_ = fStack_6ac * fVar168;
    auVar35._24_4_ = fStack_6a8 * fVar169;
    auVar35._28_4_ = 0x3fc00000;
    auVar171 = vfmadd231ps_fma(auVar35,_local_6a0,auVar9);
    auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),_local_680,auVar237);
    fVar123 = auVar3._0_4_;
    fVar226 = auVar85._0_4_;
    fVar125 = auVar3._4_4_;
    fVar229 = auVar85._4_4_;
    fVar126 = auVar3._8_4_;
    fVar230 = auVar85._8_4_;
    fVar185 = auVar3._12_4_;
    fVar231 = auVar85._12_4_;
    auVar138 = vsubps_avx(ZEXT1632(auVar171),
                          ZEXT1632(CONCAT412(fVar231 * fVar185,
                                             CONCAT48(fVar230 * fVar126,
                                                      CONCAT44(fVar229 * fVar125,fVar226 * fVar123))
                                            )));
    auVar36._4_4_ = fVar203 * fVar203;
    auVar36._0_4_ = fVar202 * fVar202;
    auVar36._8_4_ = fVar165 * fVar165;
    auVar36._12_4_ = fVar166 * fVar166;
    auVar36._16_4_ = fVar167 * fVar167;
    auVar36._20_4_ = fVar168 * fVar168;
    auVar36._24_4_ = fVar169 * fVar169;
    auVar36._28_4_ = 0;
    auVar171 = vfmadd231ps_fma(auVar36,auVar9,auVar9);
    auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar237,auVar237);
    auVar68._28_4_ = DAT_01fec480._28_4_;
    auVar68._0_28_ =
         ZEXT1628(CONCAT412(fVar185 * fVar185,
                            CONCAT48(fVar126 * fVar126,CONCAT44(fVar125 * fVar125,fVar123 * fVar123)
                                    )));
    _local_6e0 = vsubps_avx(ZEXT1632(auVar171),auVar68);
    local_760 = vsqrtps_avx(auVar92);
    fVar201 = local_760._28_4_ + auVar235._28_4_;
    fVar123 = (local_760._0_4_ + auVar235._0_4_) * 1.0000002;
    fVar125 = (local_760._4_4_ + auVar235._4_4_) * 1.0000002;
    fVar126 = (local_760._8_4_ + auVar235._8_4_) * 1.0000002;
    fVar185 = (local_760._12_4_ + auVar235._12_4_) * 1.0000002;
    fVar198 = (local_760._16_4_ + auVar235._16_4_) * 1.0000002;
    fVar199 = (local_760._20_4_ + auVar235._20_4_) * 1.0000002;
    fVar200 = (local_760._24_4_ + auVar235._24_4_) * 1.0000002;
    auVar37._4_4_ = fVar125 * fVar125;
    auVar37._0_4_ = fVar123 * fVar123;
    auVar37._8_4_ = fVar126 * fVar126;
    auVar37._12_4_ = fVar185 * fVar185;
    auVar37._16_4_ = fVar198 * fVar198;
    auVar37._20_4_ = fVar199 * fVar199;
    auVar37._24_4_ = fVar200 * fVar200;
    auVar37._28_4_ = fVar201;
    local_4e0._0_4_ = auVar138._0_4_ + auVar138._0_4_;
    local_4e0._4_4_ = auVar138._4_4_ + auVar138._4_4_;
    local_4e0._8_4_ = auVar138._8_4_ + auVar138._8_4_;
    local_4e0._12_4_ = auVar138._12_4_ + auVar138._12_4_;
    local_4e0._16_4_ = auVar138._16_4_ + auVar138._16_4_;
    local_4e0._20_4_ = auVar138._20_4_ + auVar138._20_4_;
    local_4e0._24_4_ = auVar138._24_4_ + auVar138._24_4_;
    local_4e0._28_4_ = auVar138._28_4_ + auVar138._28_4_;
    auVar235 = vsubps_avx(_local_6e0,auVar37);
    local_880._28_4_ = DAT_01fec480._28_4_;
    local_880._0_28_ =
         ZEXT1628(CONCAT412(fVar231 * fVar231,
                            CONCAT48(fVar230 * fVar230,CONCAT44(fVar229 * fVar229,fVar226 * fVar226)
                                    )));
    local_8c0 = vsubps_avx(local_2c0,local_880);
    local_740._4_4_ = local_4e0._4_4_ * local_4e0._4_4_;
    local_740._0_4_ = local_4e0._0_4_ * local_4e0._0_4_;
    local_740._8_4_ = local_4e0._8_4_ * local_4e0._8_4_;
    local_740._12_4_ = local_4e0._12_4_ * local_4e0._12_4_;
    local_740._16_4_ = local_4e0._16_4_ * local_4e0._16_4_;
    local_740._20_4_ = local_4e0._20_4_ * local_4e0._20_4_;
    local_740._24_4_ = local_4e0._24_4_ * local_4e0._24_4_;
    local_740._28_4_ = fVar201;
    fVar125 = local_8c0._0_4_;
    local_5a0._0_4_ = fVar125 * 4.0;
    fVar126 = local_8c0._4_4_;
    local_5a0._4_4_ = fVar126 * 4.0;
    fVar185 = local_8c0._8_4_;
    fStack_598 = fVar185 * 4.0;
    fVar198 = local_8c0._12_4_;
    fStack_594 = fVar198 * 4.0;
    fVar199 = local_8c0._16_4_;
    fStack_590 = fVar199 * 4.0;
    fVar200 = local_8c0._20_4_;
    fStack_58c = fVar200 * 4.0;
    fVar201 = local_8c0._24_4_;
    fStack_588 = fVar201 * 4.0;
    uStack_584 = 0x40800000;
    auVar38._4_4_ = (float)local_5a0._4_4_ * auVar235._4_4_;
    auVar38._0_4_ = (float)local_5a0._0_4_ * auVar235._0_4_;
    auVar38._8_4_ = fStack_598 * auVar235._8_4_;
    auVar38._12_4_ = fStack_594 * auVar235._12_4_;
    auVar38._16_4_ = fStack_590 * auVar235._16_4_;
    auVar38._20_4_ = fStack_58c * auVar235._20_4_;
    auVar38._24_4_ = fStack_588 * auVar235._24_4_;
    auVar38._28_4_ = 0x40800000;
    auVar138 = vsubps_avx(local_740,auVar38);
    auVar92 = vcmpps_avx(auVar138,ZEXT432(0) << 0x20,5);
    local_500 = ZEXT1632(auVar3);
    fVar123 = local_8c0._28_4_;
    if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar92 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar92 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar92 >> 0x7f,0) == '\0') &&
          (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar92 >> 0xbf,0) == '\0') &&
        (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar92[0x1f]) {
      auVar255._8_4_ = 0x7f800000;
      auVar255._0_8_ = 0x7f8000007f800000;
      auVar255._12_4_ = 0x7f800000;
      auVar255._16_4_ = 0x7f800000;
      auVar255._20_4_ = 0x7f800000;
      auVar255._24_4_ = 0x7f800000;
      auVar255._28_4_ = 0x7f800000;
      auVar178._8_4_ = 0xff800000;
      auVar178._0_8_ = 0xff800000ff800000;
      auVar178._12_4_ = 0xff800000;
      auVar178._16_4_ = 0xff800000;
      auVar178._20_4_ = 0xff800000;
      auVar178._24_4_ = 0xff800000;
      auVar178._28_4_ = 0xff800000;
    }
    else {
      auVar159 = vsqrtps_avx(auVar138);
      auVar256._0_4_ = fVar125 + fVar125;
      auVar256._4_4_ = fVar126 + fVar126;
      auVar256._8_4_ = fVar185 + fVar185;
      auVar256._12_4_ = fVar198 + fVar198;
      auVar256._16_4_ = fVar199 + fVar199;
      auVar256._20_4_ = fVar200 + fVar200;
      auVar256._24_4_ = fVar201 + fVar201;
      auVar256._28_4_ = fVar123 + fVar123;
      auVar134 = vrcpps_avx(auVar256);
      auVar116 = vcmpps_avx(auVar138,ZEXT432(0) << 0x20,5);
      auVar179._8_4_ = 0x3f800000;
      auVar179._0_8_ = 0x3f8000003f800000;
      auVar179._12_4_ = 0x3f800000;
      auVar179._16_4_ = 0x3f800000;
      auVar179._20_4_ = 0x3f800000;
      auVar179._24_4_ = 0x3f800000;
      auVar179._28_4_ = 0x3f800000;
      auVar3 = vfnmadd213ps_fma(auVar256,auVar134,auVar179);
      auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar134,auVar134);
      auVar180._0_4_ = (uint)local_4e0._0_4_ ^ local_540;
      auVar180._4_4_ = (uint)local_4e0._4_4_ ^ uStack_53c;
      auVar180._8_4_ = (uint)local_4e0._8_4_ ^ uStack_538;
      auVar180._12_4_ = (uint)local_4e0._12_4_ ^ uStack_534;
      auVar180._16_4_ = (uint)local_4e0._16_4_ ^ (uint)fStack_530;
      auVar180._20_4_ = (uint)local_4e0._20_4_ ^ (uint)fStack_52c;
      auVar180._24_4_ = (uint)local_4e0._24_4_ ^ (uint)fStack_528;
      auVar180._28_4_ = (uint)local_4e0._28_4_ ^ uStack_524;
      auVar212 = vsubps_avx(auVar180,auVar159);
      auVar39._4_4_ = auVar3._4_4_ * auVar212._4_4_;
      auVar39._0_4_ = auVar3._0_4_ * auVar212._0_4_;
      auVar39._8_4_ = auVar3._8_4_ * auVar212._8_4_;
      auVar39._12_4_ = auVar3._12_4_ * auVar212._12_4_;
      auVar39._16_4_ = auVar212._16_4_ * 0.0;
      auVar39._20_4_ = auVar212._20_4_ * 0.0;
      auVar39._24_4_ = auVar212._24_4_ * 0.0;
      auVar39._28_4_ = auVar212._28_4_;
      auVar138 = vsubps_avx(auVar159,local_4e0);
      auVar40._4_4_ = auVar3._4_4_ * auVar138._4_4_;
      auVar40._0_4_ = auVar3._0_4_ * auVar138._0_4_;
      auVar40._8_4_ = auVar3._8_4_ * auVar138._8_4_;
      auVar40._12_4_ = auVar3._12_4_ * auVar138._12_4_;
      auVar40._16_4_ = auVar138._16_4_ * 0.0;
      auVar40._20_4_ = auVar138._20_4_ * 0.0;
      auVar40._24_4_ = auVar138._24_4_ * 0.0;
      auVar40._28_4_ = auVar134._28_4_;
      auVar3 = vfmadd213ps_fma(ZEXT1632(auVar85),auVar39,local_500);
      local_560 = ZEXT1632(CONCAT412(fVar127 * auVar3._12_4_,
                                     CONCAT48(fVar128 * auVar3._8_4_,
                                              CONCAT44(fVar124 * auVar3._4_4_,fVar103 * auVar3._0_4_
                                                      ))));
      auVar138 = vandps_avx(local_880,local_720);
      auVar138 = vmaxps_avx(local_3a0,auVar138);
      auVar41._4_4_ = auVar138._4_4_ * 1.9073486e-06;
      auVar41._0_4_ = auVar138._0_4_ * 1.9073486e-06;
      auVar41._8_4_ = auVar138._8_4_ * 1.9073486e-06;
      auVar41._12_4_ = auVar138._12_4_ * 1.9073486e-06;
      auVar41._16_4_ = auVar138._16_4_ * 1.9073486e-06;
      auVar41._20_4_ = auVar138._20_4_ * 1.9073486e-06;
      auVar41._24_4_ = auVar138._24_4_ * 1.9073486e-06;
      auVar41._28_4_ = auVar138._28_4_;
      auVar138 = vandps_avx(local_8c0,local_720);
      auVar138 = vcmpps_avx(auVar138,auVar41,1);
      auVar3 = vfmadd213ps_fma(ZEXT1632(auVar85),auVar40,local_500);
      auVar219._8_4_ = 0x7f800000;
      auVar219._0_8_ = 0x7f8000007f800000;
      auVar219._12_4_ = 0x7f800000;
      auVar219._16_4_ = 0x7f800000;
      auVar219._20_4_ = 0x7f800000;
      auVar219._24_4_ = 0x7f800000;
      auVar219._28_4_ = 0x7f800000;
      auVar255 = vblendvps_avx(auVar219,auVar39,auVar116);
      _local_580 = ZEXT1628(CONCAT412(auVar3._12_4_ * fVar127,
                                      CONCAT48(auVar3._8_4_ * fVar128,
                                               CONCAT44(auVar3._4_4_ * fVar124,
                                                        auVar3._0_4_ * fVar103))));
      uStack_564 = auVar212._28_4_;
      auVar181._8_4_ = 0xff800000;
      auVar181._0_8_ = 0xff800000ff800000;
      auVar181._12_4_ = 0xff800000;
      auVar181._16_4_ = 0xff800000;
      auVar181._20_4_ = 0xff800000;
      auVar181._24_4_ = 0xff800000;
      auVar181._28_4_ = 0xff800000;
      auVar178 = vblendvps_avx(auVar181,auVar40,auVar116);
      auVar134 = auVar116 & auVar138;
      if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar134 >> 0x7f,0) != '\0') ||
            (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar134 >> 0xbf,0) != '\0') ||
          (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar134[0x1f] < '\0') {
        auVar92 = vandps_avx(auVar138,auVar116);
        auVar138 = vcmpps_avx(auVar235,ZEXT832(0) << 0x20,2);
        auVar220._8_4_ = 0xff800000;
        auVar220._0_8_ = 0xff800000ff800000;
        auVar220._12_4_ = 0xff800000;
        auVar220._16_4_ = 0xff800000;
        auVar220._20_4_ = 0xff800000;
        auVar220._24_4_ = 0xff800000;
        auVar220._28_4_ = 0xff800000;
        auVar247._8_4_ = 0x7f800000;
        auVar247._0_8_ = 0x7f8000007f800000;
        auVar247._12_4_ = 0x7f800000;
        auVar247._16_4_ = 0x7f800000;
        auVar247._20_4_ = 0x7f800000;
        auVar247._24_4_ = 0x7f800000;
        auVar247._28_4_ = 0x7f800000;
        auVar235 = vblendvps_avx(auVar247,auVar220,auVar138);
        auVar3 = vpackssdw_avx(auVar92._0_16_,auVar92._16_16_);
        auVar134 = vpmovsxwd_avx2(auVar3);
        auVar255 = vblendvps_avx(auVar255,auVar235,auVar134);
        auVar235 = vblendvps_avx(auVar220,auVar247,auVar138);
        auVar178 = vblendvps_avx(auVar178,auVar235,auVar134);
        auVar102._0_8_ = auVar92._0_8_ ^ 0xffffffffffffffff;
        auVar102._8_4_ = auVar92._8_4_ ^ 0xffffffff;
        auVar102._12_4_ = auVar92._12_4_ ^ 0xffffffff;
        auVar102._16_4_ = auVar92._16_4_ ^ 0xffffffff;
        auVar102._20_4_ = auVar92._20_4_ ^ 0xffffffff;
        auVar102._24_4_ = auVar92._24_4_ ^ 0xffffffff;
        auVar102._28_4_ = auVar92._28_4_ ^ 0xffffffff;
        auVar92 = vorps_avx(auVar138,auVar102);
        auVar92 = vandps_avx(auVar116,auVar92);
      }
    }
    auVar138 = local_380 & auVar92;
    auVar235 = _local_6a0;
    if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar138 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar138 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar138 >> 0x7f,0) == '\0') &&
          (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar138 >> 0xbf,0) == '\0') &&
        (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar138[0x1f])
    {
LAB_0175d46b:
      auVar239 = ZEXT3264(auVar237);
      auVar228 = ZEXT3264(auVar235);
      auVar244 = ZEXT3264(local_9a0);
      auVar252 = ZEXT3264(local_9c0);
      auVar258 = ZEXT3264(local_9e0);
      auVar222 = ZEXT3264(local_940);
      auVar225 = ZEXT3264(local_a00);
    }
    else {
      auVar134 = local_880;
      fVar226 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_780._0_4_;
      auVar95._4_4_ = fVar226;
      auVar95._0_4_ = fVar226;
      auVar95._8_4_ = fVar226;
      auVar95._12_4_ = fVar226;
      auVar95._16_4_ = fVar226;
      auVar95._20_4_ = fVar226;
      auVar95._24_4_ = fVar226;
      auVar95._28_4_ = fVar226;
      auVar138 = vmaxps_avx(auVar95,auVar255);
      fVar226 = (ray->super_RayK<1>).tfar - (float)local_780._0_4_;
      auVar194._4_4_ = fVar226;
      auVar194._0_4_ = fVar226;
      auVar194._8_4_ = fVar226;
      auVar194._12_4_ = fVar226;
      auVar194._16_4_ = fVar226;
      auVar194._20_4_ = fVar226;
      auVar194._24_4_ = fVar226;
      auVar194._28_4_ = fVar226;
      auVar116 = vminps_avx(auVar194,auVar178);
      auVar136._0_4_ = local_600._0_4_ * fVar202;
      auVar136._4_4_ = local_600._4_4_ * fVar203;
      auVar136._8_4_ = local_600._8_4_ * fVar165;
      auVar136._12_4_ = local_600._12_4_ * fVar166;
      auVar136._16_4_ = local_600._16_4_ * fVar167;
      auVar136._20_4_ = local_600._20_4_ * fVar168;
      auVar136._24_4_ = local_600._24_4_ * fVar169;
      auVar136._28_4_ = 0;
      auVar3 = vfmadd213ps_fma(auVar9,local_920,auVar136);
      auVar171 = vfmadd213ps_fma(auVar237,local_7c0,ZEXT1632(auVar3));
      auVar158._0_4_ = local_6c0 * local_600._0_4_;
      auVar158._4_4_ = fStack_6bc * local_600._4_4_;
      auVar158._8_4_ = fStack_6b8 * local_600._8_4_;
      auVar158._12_4_ = fStack_6b4 * local_600._12_4_;
      auVar158._16_4_ = fStack_6b0 * local_600._16_4_;
      auVar158._20_4_ = fStack_6ac * local_600._20_4_;
      auVar158._24_4_ = fStack_6a8 * local_600._24_4_;
      auVar158._28_4_ = 0;
      auVar3 = vfmadd231ps_fma(auVar158,_local_6a0,local_920);
      auVar132 = vfmadd231ps_fma(ZEXT1632(auVar3),_local_680,local_7c0);
      auVar235 = vandps_avx(local_720,ZEXT1632(auVar132));
      auVar246._8_4_ = 0x219392ef;
      auVar246._0_8_ = 0x219392ef219392ef;
      auVar246._12_4_ = 0x219392ef;
      auVar246._16_4_ = 0x219392ef;
      auVar246._20_4_ = 0x219392ef;
      auVar246._24_4_ = 0x219392ef;
      auVar246._28_4_ = 0x219392ef;
      auVar9 = vcmpps_avx(auVar235,auVar246,1);
      auVar235 = vrcpps_avx(ZEXT1632(auVar132));
      auVar215._8_4_ = 0x3f800000;
      auVar215._0_8_ = 0x3f8000003f800000;
      auVar215._12_4_ = 0x3f800000;
      auVar215._16_4_ = 0x3f800000;
      auVar215._20_4_ = 0x3f800000;
      auVar215._24_4_ = 0x3f800000;
      auVar215._28_4_ = 0x3f800000;
      auVar216 = ZEXT3264(auVar215);
      auVar159 = ZEXT1632(auVar132);
      auVar3 = vfnmadd213ps_fma(auVar235,auVar159,auVar215);
      auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar235,auVar235);
      auVar236._0_4_ = local_540 ^ auVar132._0_4_;
      auVar236._4_4_ = uStack_53c ^ auVar132._4_4_;
      auVar236._8_4_ = uStack_538 ^ auVar132._8_4_;
      auVar236._12_4_ = uStack_534 ^ auVar132._12_4_;
      auVar236._16_4_ = fStack_530;
      auVar236._20_4_ = fStack_52c;
      auVar236._24_4_ = fStack_528;
      auVar236._28_4_ = uStack_524;
      auVar42._4_4_ = auVar3._4_4_ * (float)(auVar171._4_4_ ^ uStack_53c);
      auVar42._0_4_ = auVar3._0_4_ * (float)(auVar171._0_4_ ^ local_540);
      auVar42._8_4_ = auVar3._8_4_ * (float)(auVar171._8_4_ ^ uStack_538);
      auVar42._12_4_ = auVar3._12_4_ * (float)(auVar171._12_4_ ^ uStack_534);
      auVar42._16_4_ = fStack_530 * 0.0;
      auVar42._20_4_ = fStack_52c * 0.0;
      auVar42._24_4_ = fStack_528 * 0.0;
      auVar42._28_4_ = uStack_524;
      auVar235 = vcmpps_avx(auVar159,auVar236,1);
      auVar235 = vorps_avx(auVar9,auVar235);
      auVar257._8_4_ = 0xff800000;
      auVar257._0_8_ = 0xff800000ff800000;
      auVar257._12_4_ = 0xff800000;
      auVar257._16_4_ = 0xff800000;
      auVar257._20_4_ = 0xff800000;
      auVar257._24_4_ = 0xff800000;
      auVar257._28_4_ = 0xff800000;
      auVar235 = vblendvps_avx(auVar42,auVar257,auVar235);
      auVar138 = vmaxps_avx(auVar138,auVar235);
      auVar235 = vcmpps_avx(auVar159,auVar236,6);
      auVar235 = vorps_avx(auVar9,auVar235);
      auVar237._8_4_ = 0x7f800000;
      auVar237._0_8_ = 0x7f8000007f800000;
      auVar237._12_4_ = 0x7f800000;
      auVar237._16_4_ = 0x7f800000;
      auVar237._20_4_ = 0x7f800000;
      auVar237._24_4_ = 0x7f800000;
      auVar237._28_4_ = 0x7f800000;
      auVar235 = vblendvps_avx(auVar42,auVar237,auVar235);
      auVar116 = vminps_avx(auVar116,auVar235);
      fVar202 = (float)(local_540 ^ (uint)local_a40._0_4_);
      fVar203 = (float)(uStack_53c ^ (uint)local_a40._4_4_);
      fVar165 = (float)(uStack_538 ^ (uint)local_a40._8_4_);
      fVar166 = (float)(uStack_534 ^ (uint)local_a40._12_4_);
      fVar167 = (float)((uint)fStack_530 ^ (uint)local_a40._16_4_);
      fVar168 = (float)((uint)fStack_52c ^ (uint)local_a40._20_4_);
      fVar169 = (float)((uint)fStack_528 ^ (uint)local_a40._24_4_);
      auVar182._0_4_ = local_540 ^ (uint)local_840._0_4_;
      auVar182._4_4_ = uStack_53c ^ (uint)local_840._4_4_;
      auVar182._8_4_ = uStack_538 ^ (uint)local_840._8_4_;
      auVar182._12_4_ = uStack_534 ^ (uint)local_840._12_4_;
      auVar182._16_4_ = (uint)fStack_530 ^ (uint)local_840._16_4_;
      auVar182._20_4_ = (uint)fStack_52c ^ (uint)local_840._20_4_;
      auVar182._24_4_ = (uint)fStack_528 ^ (uint)local_840._24_4_;
      auVar182._28_4_ = uStack_524 ^ local_840._28_4_;
      auVar235 = vsubps_avx(ZEXT832(0) << 0x20,local_8a0);
      auVar9 = vsubps_avx(ZEXT832(0) << 0x20,_local_7a0);
      auVar43._4_4_ = auVar9._4_4_ * fVar203;
      auVar43._0_4_ = auVar9._0_4_ * fVar202;
      auVar43._8_4_ = auVar9._8_4_ * fVar165;
      auVar43._12_4_ = auVar9._12_4_ * fVar166;
      auVar43._16_4_ = auVar9._16_4_ * fVar167;
      auVar43._20_4_ = auVar9._20_4_ * fVar168;
      auVar43._24_4_ = auVar9._24_4_ * fVar169;
      auVar43._28_4_ = auVar9._28_4_;
      auVar3 = vfmadd231ps_fma(auVar43,auVar182,auVar235);
      auVar195._0_4_ = local_540 ^ (uint)local_a20._0_4_;
      auVar195._4_4_ = uStack_53c ^ (uint)local_a20._4_4_;
      auVar195._8_4_ = uStack_538 ^ (uint)local_a20._8_4_;
      auVar195._12_4_ = uStack_534 ^ (uint)local_a20._12_4_;
      auVar195._16_4_ = (uint)fStack_530 ^ (uint)local_a20._16_4_;
      auVar195._20_4_ = (uint)fStack_52c ^ (uint)local_a20._20_4_;
      auVar195._24_4_ = (uint)fStack_528 ^ (uint)local_a20._24_4_;
      auVar195._28_4_ = uStack_524 ^ local_a20._28_4_;
      auVar235 = vsubps_avx(ZEXT832(0) << 0x20,auVar10);
      auVar171 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar195,auVar235);
      auVar44._4_4_ = fVar203 * fStack_6bc;
      auVar44._0_4_ = fVar202 * local_6c0;
      auVar44._8_4_ = fVar165 * fStack_6b8;
      auVar44._12_4_ = fVar166 * fStack_6b4;
      auVar44._16_4_ = fVar167 * fStack_6b0;
      auVar44._20_4_ = fVar168 * fStack_6ac;
      auVar44._24_4_ = fVar169 * fStack_6a8;
      auVar44._28_4_ = uStack_524 ^ local_a40._28_4_;
      auVar3 = vfmadd231ps_fma(auVar44,auVar182,_local_6a0);
      auVar132 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar195,_local_680);
      auVar235 = vandps_avx(local_720,ZEXT1632(auVar132));
      auVar10 = vrcpps_avx(ZEXT1632(auVar132));
      auVar9 = vcmpps_avx(auVar235,auVar246,1);
      auVar159 = ZEXT1632(auVar132);
      auVar3 = vfnmadd213ps_fma(auVar10,auVar159,auVar215);
      auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar10,auVar10);
      auVar196._0_4_ = local_540 ^ auVar132._0_4_;
      auVar196._4_4_ = uStack_53c ^ auVar132._4_4_;
      auVar196._8_4_ = uStack_538 ^ auVar132._8_4_;
      auVar196._12_4_ = uStack_534 ^ auVar132._12_4_;
      auVar196._16_4_ = fStack_530;
      auVar196._20_4_ = fStack_52c;
      auVar196._24_4_ = fStack_528;
      auVar196._28_4_ = uStack_524;
      auVar45._4_4_ = auVar3._4_4_ * (float)(uStack_53c ^ auVar171._4_4_);
      auVar45._0_4_ = auVar3._0_4_ * (float)(local_540 ^ auVar171._0_4_);
      auVar45._8_4_ = auVar3._8_4_ * (float)(uStack_538 ^ auVar171._8_4_);
      auVar45._12_4_ = auVar3._12_4_ * (float)(uStack_534 ^ auVar171._12_4_);
      auVar45._16_4_ = fStack_530 * 0.0;
      auVar45._20_4_ = fStack_52c * 0.0;
      auVar45._24_4_ = fStack_528 * 0.0;
      auVar45._28_4_ = uStack_524;
      auVar235 = vcmpps_avx(auVar159,auVar196,1);
      auVar235 = vorps_avx(auVar235,auVar9);
      auVar235 = vblendvps_avx(auVar45,auVar257,auVar235);
      _local_520 = vmaxps_avx(auVar138,auVar235);
      auVar138 = vcmpps_avx(auVar159,auVar196,6);
      auVar9 = vorps_avx(auVar9,auVar138);
      auVar9 = vblendvps_avx(auVar45,auVar237,auVar9);
      auVar92 = vandps_avx(auVar92,local_380);
      local_400 = vminps_avx(auVar116,auVar9);
      auVar9 = vcmpps_avx(_local_520,local_400,2);
      auVar138 = auVar92 & auVar9;
      if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar138 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar138 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar138 >> 0x7f,0) == '\0') &&
            (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar138 >> 0xbf,0) == '\0') &&
          (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar138[0x1f]) goto LAB_0175d46b;
      auVar10 = _local_520;
      auVar235 = vminps_avx(local_560,auVar215);
      auVar235 = vmaxps_avx(auVar235,ZEXT832(0) << 0x20);
      auVar138 = vminps_avx(_local_580,auVar215);
      auVar138 = vmaxps_avx(auVar138,ZEXT832(0) << 0x20);
      auVar46._4_4_ = (auVar235._4_4_ + 1.0) * 0.125;
      auVar46._0_4_ = (auVar235._0_4_ + 0.0) * 0.125;
      auVar46._8_4_ = (auVar235._8_4_ + 2.0) * 0.125;
      auVar46._12_4_ = (auVar235._12_4_ + 3.0) * 0.125;
      auVar46._16_4_ = (auVar235._16_4_ + 4.0) * 0.125;
      auVar46._20_4_ = (auVar235._20_4_ + 5.0) * 0.125;
      auVar46._24_4_ = (auVar235._24_4_ + 6.0) * 0.125;
      auVar46._28_4_ = auVar235._28_4_ + 7.0;
      auVar3 = vfmadd213ps_fma(auVar46,local_620,local_700);
      auVar47._4_4_ = (auVar138._4_4_ + 1.0) * 0.125;
      auVar47._0_4_ = (auVar138._0_4_ + 0.0) * 0.125;
      auVar47._8_4_ = (auVar138._8_4_ + 2.0) * 0.125;
      auVar47._12_4_ = (auVar138._12_4_ + 3.0) * 0.125;
      auVar47._16_4_ = (auVar138._16_4_ + 4.0) * 0.125;
      auVar47._20_4_ = (auVar138._20_4_ + 5.0) * 0.125;
      auVar47._24_4_ = (auVar138._24_4_ + 6.0) * 0.125;
      auVar47._28_4_ = auVar138._28_4_ + 7.0;
      auVar171 = vfmadd213ps_fma(auVar47,local_620,local_700);
      auVar235 = vminps_avx(_local_800,local_640);
      auVar138 = vminps_avx(local_660,local_820);
      auVar235 = vminps_avx(auVar235,auVar138);
      auVar138 = vsubps_avx(auVar235,local_760);
      auVar92 = vandps_avx(auVar9,auVar92);
      local_1a0 = ZEXT1632(auVar3);
      local_1c0 = ZEXT1632(auVar171);
      auVar48._4_4_ = auVar138._4_4_ * 0.99999976;
      auVar48._0_4_ = auVar138._0_4_ * 0.99999976;
      auVar48._8_4_ = auVar138._8_4_ * 0.99999976;
      auVar48._12_4_ = auVar138._12_4_ * 0.99999976;
      auVar48._16_4_ = auVar138._16_4_ * 0.99999976;
      auVar48._20_4_ = auVar138._20_4_ * 0.99999976;
      auVar48._24_4_ = auVar138._24_4_ * 0.99999976;
      auVar48._28_4_ = 0x3f7ffffc;
      auVar235 = vmaxps_avx(ZEXT832(0) << 0x20,auVar48);
      auVar49._4_4_ = auVar235._4_4_ * auVar235._4_4_;
      auVar49._0_4_ = auVar235._0_4_ * auVar235._0_4_;
      auVar49._8_4_ = auVar235._8_4_ * auVar235._8_4_;
      auVar49._12_4_ = auVar235._12_4_ * auVar235._12_4_;
      auVar49._16_4_ = auVar235._16_4_ * auVar235._16_4_;
      auVar49._20_4_ = auVar235._20_4_ * auVar235._20_4_;
      auVar49._24_4_ = auVar235._24_4_ * auVar235._24_4_;
      auVar49._28_4_ = auVar235._28_4_;
      auVar9 = vsubps_avx(_local_6e0,auVar49);
      auVar50._4_4_ = auVar9._4_4_ * (float)local_5a0._4_4_;
      auVar50._0_4_ = auVar9._0_4_ * (float)local_5a0._0_4_;
      auVar50._8_4_ = auVar9._8_4_ * fStack_598;
      auVar50._12_4_ = auVar9._12_4_ * fStack_594;
      auVar50._16_4_ = auVar9._16_4_ * fStack_590;
      auVar50._20_4_ = auVar9._20_4_ * fStack_58c;
      auVar50._24_4_ = auVar9._24_4_ * fStack_588;
      auVar50._28_4_ = auVar235._28_4_;
      auVar235 = vsubps_avx(local_740,auVar50);
      local_8a0 = vcmpps_avx(auVar235,ZEXT832(0) << 0x20,5);
      if ((((((((local_8a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_8a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_8a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_8a0 >> 0x7f,0) == '\0') &&
            (local_8a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_8a0 >> 0xbf,0) == '\0') &&
          (local_8a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_8a0[0x1f]) {
        auVar61 = ZEXT412(0);
        auVar137 = ZEXT1232(auVar61) << 0x20;
        local_740 = ZEXT1232(auVar61) << 0x20;
        local_760 = ZEXT1232(auVar61) << 0x20;
        _local_5a0 = ZEXT1232(auVar61) << 0x20;
        auVar160 = SUB6432(ZEXT864(0),0) << 0x20;
        _local_ae0 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar197._8_4_ = 0x7f800000;
        auVar197._0_8_ = 0x7f8000007f800000;
        auVar197._12_4_ = 0x7f800000;
        auVar197._16_4_ = 0x7f800000;
        auVar197._20_4_ = 0x7f800000;
        auVar197._24_4_ = 0x7f800000;
        auVar197._28_4_ = 0x7f800000;
        auVar205._8_4_ = 0xff800000;
        auVar205._0_8_ = 0xff800000ff800000;
        auVar205._12_4_ = 0xff800000;
        auVar205._16_4_ = 0xff800000;
        auVar205._20_4_ = 0xff800000;
        auVar205._24_4_ = 0xff800000;
        auVar205._28_4_ = 0xff800000;
      }
      else {
        auVar159 = vsqrtps_avx(auVar235);
        auVar161._0_4_ = fVar125 + fVar125;
        auVar161._4_4_ = fVar126 + fVar126;
        auVar161._8_4_ = fVar185 + fVar185;
        auVar161._12_4_ = fVar198 + fVar198;
        auVar161._16_4_ = fVar199 + fVar199;
        auVar161._20_4_ = fVar200 + fVar200;
        auVar161._24_4_ = fVar201 + fVar201;
        auVar161._28_4_ = fVar123 + fVar123;
        auVar116 = vrcpps_avx(auVar161);
        auVar3 = vfnmadd213ps_fma(auVar161,auVar116,auVar215);
        auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar116,auVar116);
        auVar183._0_4_ = (uint)local_4e0._0_4_ ^ local_540;
        auVar183._4_4_ = (uint)local_4e0._4_4_ ^ uStack_53c;
        auVar183._8_4_ = (uint)local_4e0._8_4_ ^ uStack_538;
        auVar183._12_4_ = (uint)local_4e0._12_4_ ^ uStack_534;
        auVar183._16_4_ = (uint)local_4e0._16_4_ ^ (uint)fStack_530;
        auVar183._20_4_ = (uint)local_4e0._20_4_ ^ (uint)fStack_52c;
        auVar183._24_4_ = (uint)local_4e0._24_4_ ^ (uint)fStack_528;
        auVar183._28_4_ = (uint)local_4e0._28_4_ ^ uStack_524;
        auVar116 = vsubps_avx(auVar183,auVar159);
        auVar159 = vsubps_avx(auVar159,local_4e0);
        fVar123 = auVar116._0_4_ * auVar3._0_4_;
        fVar125 = auVar116._4_4_ * auVar3._4_4_;
        auVar51._4_4_ = fVar125;
        auVar51._0_4_ = fVar123;
        fVar126 = auVar116._8_4_ * auVar3._8_4_;
        auVar51._8_4_ = fVar126;
        fVar185 = auVar116._12_4_ * auVar3._12_4_;
        auVar51._12_4_ = fVar185;
        fVar198 = auVar116._16_4_ * 0.0;
        auVar51._16_4_ = fVar198;
        fVar199 = auVar116._20_4_ * 0.0;
        auVar51._20_4_ = fVar199;
        fVar200 = auVar116._24_4_ * 0.0;
        auVar51._24_4_ = fVar200;
        auVar51._28_4_ = auVar138._28_4_;
        fVar201 = auVar159._0_4_ * auVar3._0_4_;
        fVar202 = auVar159._4_4_ * auVar3._4_4_;
        auVar52._4_4_ = fVar202;
        auVar52._0_4_ = fVar201;
        fVar203 = auVar159._8_4_ * auVar3._8_4_;
        auVar52._8_4_ = fVar203;
        fVar165 = auVar159._12_4_ * auVar3._12_4_;
        auVar52._12_4_ = fVar165;
        fVar166 = auVar159._16_4_ * 0.0;
        auVar52._16_4_ = fVar166;
        fVar167 = auVar159._20_4_ * 0.0;
        auVar52._20_4_ = fVar167;
        fVar168 = auVar159._24_4_ * 0.0;
        auVar52._24_4_ = fVar168;
        auVar52._28_4_ = 0x219392ef;
        auVar3 = vfmadd213ps_fma(ZEXT1632(auVar85),auVar51,local_500);
        auVar85 = vfmadd213ps_fma(ZEXT1632(auVar85),auVar52,local_500);
        auVar53._28_4_ = auVar116._28_4_;
        auVar53._0_28_ =
             ZEXT1628(CONCAT412(fVar127 * auVar3._12_4_,
                                CONCAT48(fVar128 * auVar3._8_4_,
                                         CONCAT44(fVar124 * auVar3._4_4_,fVar103 * auVar3._0_4_))));
        auVar138 = ZEXT1632(CONCAT412(fVar127 * auVar85._12_4_,
                                      CONCAT48(fVar128 * auVar85._8_4_,
                                               CONCAT44(fVar124 * auVar85._4_4_,
                                                        fVar103 * auVar85._0_4_))));
        auVar85 = vfmadd213ps_fma(_local_5c0,auVar53,auVar160);
        auVar3 = vfmadd213ps_fma(_local_5c0,auVar138,auVar160);
        auVar171 = vfmadd213ps_fma(local_4c0,auVar53,auVar137);
        auVar132 = vfmadd213ps_fma(local_4c0,auVar138,auVar137);
        auVar192 = vfmadd213ps_fma(auVar53,local_4a0,local_480);
        auVar89 = vfmadd213ps_fma(local_4a0,auVar138,local_480);
        auVar54._4_4_ = (float)local_680._4_4_ * fVar125;
        auVar54._0_4_ = (float)local_680._0_4_ * fVar123;
        auVar54._8_4_ = fStack_678 * fVar126;
        auVar54._12_4_ = fStack_674 * fVar185;
        auVar54._16_4_ = fStack_670 * fVar198;
        auVar54._20_4_ = fStack_66c * fVar199;
        auVar54._24_4_ = fStack_668 * fVar200;
        auVar54._28_4_ = 0;
        auVar137 = vsubps_avx(auVar54,ZEXT1632(auVar85));
        auVar162._0_4_ = (float)local_6a0._0_4_ * fVar123;
        auVar162._4_4_ = (float)local_6a0._4_4_ * fVar125;
        auVar162._8_4_ = fStack_698 * fVar126;
        auVar162._12_4_ = fStack_694 * fVar185;
        auVar162._16_4_ = fStack_690 * fVar198;
        auVar162._20_4_ = fStack_68c * fVar199;
        auVar162._24_4_ = fStack_688 * fVar200;
        auVar162._28_4_ = 0;
        auVar160 = vsubps_avx(auVar162,ZEXT1632(auVar171));
        auVar206._0_4_ = local_6c0 * fVar123;
        auVar206._4_4_ = fStack_6bc * fVar125;
        auVar206._8_4_ = fStack_6b8 * fVar126;
        auVar206._12_4_ = fStack_6b4 * fVar185;
        auVar206._16_4_ = fStack_6b0 * fVar198;
        auVar206._20_4_ = fStack_6ac * fVar199;
        auVar206._24_4_ = fStack_6a8 * fVar200;
        auVar206._28_4_ = 0;
        auVar138 = vsubps_avx(auVar206,ZEXT1632(auVar192));
        _local_ae0 = auVar138._0_28_;
        auVar55._4_4_ = (float)local_680._4_4_ * fVar202;
        auVar55._0_4_ = (float)local_680._0_4_ * fVar201;
        auVar55._8_4_ = fStack_678 * fVar203;
        auVar55._12_4_ = fStack_674 * fVar165;
        auVar55._16_4_ = fStack_670 * fVar166;
        auVar55._20_4_ = fStack_66c * fVar167;
        auVar55._24_4_ = fStack_668 * fVar168;
        auVar55._28_4_ = 0;
        local_740 = vsubps_avx(auVar55,ZEXT1632(auVar3));
        auVar56._4_4_ = (float)local_6a0._4_4_ * fVar202;
        auVar56._0_4_ = (float)local_6a0._0_4_ * fVar201;
        auVar56._8_4_ = fStack_698 * fVar203;
        auVar56._12_4_ = fStack_694 * fVar165;
        auVar56._16_4_ = fStack_690 * fVar166;
        auVar56._20_4_ = fStack_68c * fVar167;
        auVar56._24_4_ = fStack_688 * fVar168;
        auVar56._28_4_ = local_740._28_4_;
        local_760 = vsubps_avx(auVar56,ZEXT1632(auVar132));
        auVar57._4_4_ = fStack_6bc * fVar202;
        auVar57._0_4_ = local_6c0 * fVar201;
        auVar57._8_4_ = fStack_6b8 * fVar203;
        auVar57._12_4_ = fStack_6b4 * fVar165;
        auVar57._16_4_ = fStack_6b0 * fVar166;
        auVar57._20_4_ = fStack_6ac * fVar167;
        auVar57._24_4_ = fStack_6a8 * fVar168;
        auVar57._28_4_ = local_760._28_4_;
        _local_5a0 = vsubps_avx(auVar57,ZEXT1632(auVar89));
        auVar138 = vcmpps_avx(auVar235,_DAT_01faff00,5);
        auVar207._8_4_ = 0x7f800000;
        auVar207._0_8_ = 0x7f8000007f800000;
        auVar207._12_4_ = 0x7f800000;
        auVar207._16_4_ = 0x7f800000;
        auVar207._20_4_ = 0x7f800000;
        auVar207._24_4_ = 0x7f800000;
        auVar207._28_4_ = 0x7f800000;
        auVar197 = vblendvps_avx(auVar207,auVar51,auVar138);
        auVar235 = vandps_avx(local_720,local_880);
        auVar235 = vmaxps_avx(local_3a0,auVar235);
        auVar58._4_4_ = auVar235._4_4_ * 1.9073486e-06;
        auVar58._0_4_ = auVar235._0_4_ * 1.9073486e-06;
        auVar58._8_4_ = auVar235._8_4_ * 1.9073486e-06;
        auVar58._12_4_ = auVar235._12_4_ * 1.9073486e-06;
        auVar58._16_4_ = auVar235._16_4_ * 1.9073486e-06;
        auVar58._20_4_ = auVar235._20_4_ * 1.9073486e-06;
        auVar58._24_4_ = auVar235._24_4_ * 1.9073486e-06;
        auVar58._28_4_ = auVar235._28_4_;
        auVar235 = vandps_avx(local_720,local_8c0);
        auVar235 = vcmpps_avx(auVar235,auVar58,1);
        auVar208._8_4_ = 0xff800000;
        auVar208._0_8_ = 0xff800000ff800000;
        auVar208._12_4_ = 0xff800000;
        auVar208._16_4_ = 0xff800000;
        auVar208._20_4_ = 0xff800000;
        auVar208._24_4_ = 0xff800000;
        auVar208._28_4_ = 0xff800000;
        auVar205 = vblendvps_avx(auVar208,auVar52,auVar138);
        auVar116 = auVar138 & auVar235;
        if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar116 >> 0x7f,0) != '\0') ||
              (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar116 >> 0xbf,0) != '\0') ||
            (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar116[0x1f] < '\0') {
          auVar235 = vandps_avx(auVar235,auVar138);
          auVar116 = vcmpps_avx(auVar9,ZEXT832(0) << 0x20,2);
          auVar243._8_4_ = 0xff800000;
          auVar243._0_8_ = 0xff800000ff800000;
          auVar243._12_4_ = 0xff800000;
          auVar243._16_4_ = 0xff800000;
          auVar243._20_4_ = 0xff800000;
          auVar243._24_4_ = 0xff800000;
          auVar243._28_4_ = 0xff800000;
          auVar248._8_4_ = 0x7f800000;
          auVar248._0_8_ = 0x7f8000007f800000;
          auVar248._12_4_ = 0x7f800000;
          auVar248._16_4_ = 0x7f800000;
          auVar248._20_4_ = 0x7f800000;
          auVar248._24_4_ = 0x7f800000;
          auVar248._28_4_ = 0x7f800000;
          auVar9 = vblendvps_avx(auVar248,auVar243,auVar116);
          auVar85 = vpackssdw_avx(auVar235._0_16_,auVar235._16_16_);
          auVar159 = vpmovsxwd_avx2(auVar85);
          auVar197 = vblendvps_avx(auVar197,auVar9,auVar159);
          auVar9 = vblendvps_avx(auVar243,auVar248,auVar116);
          auVar205 = vblendvps_avx(auVar205,auVar9,auVar159);
          auVar221._0_8_ = auVar235._0_8_ ^ 0xffffffffffffffff;
          auVar221._8_4_ = auVar235._8_4_ ^ 0xffffffff;
          auVar221._12_4_ = auVar235._12_4_ ^ 0xffffffff;
          auVar221._16_4_ = auVar235._16_4_ ^ 0xffffffff;
          auVar221._20_4_ = auVar235._20_4_ ^ 0xffffffff;
          auVar221._24_4_ = auVar235._24_4_ ^ 0xffffffff;
          auVar221._28_4_ = auVar235._28_4_ ^ 0xffffffff;
          auVar235 = vorps_avx(auVar116,auVar221);
          local_8a0 = vandps_avx(auVar235,auVar138);
        }
      }
      auVar244 = ZEXT3264(local_9a0);
      auVar252 = ZEXT3264(local_9c0);
      auVar258 = ZEXT3264(local_9e0);
      auVar225 = ZEXT3264(local_a00);
      uVar79 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar238._4_4_ = uVar79;
      auVar238._0_4_ = uVar79;
      auVar238._8_4_ = uVar79;
      auVar238._12_4_ = uVar79;
      auVar238._16_4_ = uVar79;
      auVar238._20_4_ = uVar79;
      auVar238._24_4_ = uVar79;
      auVar238._28_4_ = uVar79;
      auVar239 = ZEXT3264(auVar238);
      uVar79 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar184._4_4_ = uVar79;
      auVar184._0_4_ = uVar79;
      auVar184._8_4_ = uVar79;
      auVar184._12_4_ = uVar79;
      auVar184._16_4_ = uVar79;
      auVar184._20_4_ = uVar79;
      auVar184._24_4_ = uVar79;
      auVar184._28_4_ = uVar79;
      fVar103 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar228 = ZEXT3264(_local_520);
      local_3e0 = _local_520;
      local_3c0 = vminps_avx(local_400,auVar197);
      local_420 = vmaxps_avx(_local_520,auVar205);
      auVar235 = vcmpps_avx(_local_520,local_3c0,2);
      local_480 = vandps_avx(auVar235,auVar92);
      auVar235 = vcmpps_avx(local_420,local_400,2);
      local_4c0 = vandps_avx(auVar235,auVar92);
      auVar92 = vorps_avx(local_4c0,local_480);
      if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar92 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar92 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar92 >> 0x7f,0) == '\0') &&
            (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar92 >> 0xbf,0) == '\0') &&
          (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar92[0x1f])
      {
        auVar222 = ZEXT3264(local_940);
      }
      else {
        _local_5c0 = local_420;
        auVar235 = _local_5c0;
        local_4e0._0_8_ = local_8a0._0_8_ ^ 0xffffffffffffffff;
        local_4e0._8_4_ = (float)(local_8a0._8_4_ ^ 0xffffffff);
        local_4e0._12_4_ = (float)(local_8a0._12_4_ ^ 0xffffffff);
        local_4e0._16_4_ = (float)(local_8a0._16_4_ ^ 0xffffffff);
        local_4e0._20_4_ = (float)(local_8a0._20_4_ ^ 0xffffffff);
        local_4e0._24_4_ = (float)(local_8a0._24_4_ ^ 0xffffffff);
        local_4e0._28_4_ = (float)(local_8a0._28_4_ ^ 0xffffffff);
        auVar59._4_4_ = fVar103 * (float)local_ae0._4_4_;
        auVar59._0_4_ = fVar103 * (float)local_ae0._0_4_;
        auVar59._8_4_ = fVar103 * fStack_ad8;
        auVar59._12_4_ = fVar103 * fStack_ad4;
        auVar59._16_4_ = fVar103 * fStack_ad0;
        auVar59._20_4_ = fVar103 * fStack_acc;
        auVar59._24_4_ = fVar103 * fStack_ac8;
        auVar59._28_4_ = local_8a0._28_4_;
        auVar85 = vfmadd213ps_fma(auVar160,auVar184,auVar59);
        auVar85 = vfmadd213ps_fma(auVar137,auVar238,ZEXT1632(auVar85));
        auVar92 = vandps_avx(ZEXT1632(auVar85),local_720);
        auVar119._8_4_ = 0x3e99999a;
        auVar119._0_8_ = 0x3e99999a3e99999a;
        auVar119._12_4_ = 0x3e99999a;
        auVar119._16_4_ = 0x3e99999a;
        auVar119._20_4_ = 0x3e99999a;
        auVar119._24_4_ = 0x3e99999a;
        auVar119._28_4_ = 0x3e99999a;
        auVar92 = vcmpps_avx(auVar92,auVar119,1);
        auVar92 = vorps_avx(auVar92,local_4e0);
        auVar120._8_4_ = 3;
        auVar120._0_8_ = 0x300000003;
        auVar120._12_4_ = 3;
        auVar120._16_4_ = 3;
        auVar120._20_4_ = 3;
        auVar120._24_4_ = 3;
        auVar120._28_4_ = 3;
        auVar139._8_4_ = 2;
        auVar139._0_8_ = 0x200000002;
        auVar139._12_4_ = 2;
        auVar139._16_4_ = 2;
        auVar139._20_4_ = 2;
        auVar139._24_4_ = 2;
        auVar139._28_4_ = 2;
        auVar92 = vblendvps_avx(auVar139,auVar120,auVar92);
        local_500._4_4_ = local_aec;
        local_500._0_4_ = local_aec;
        local_500._8_4_ = local_aec;
        local_500._12_4_ = local_aec;
        local_500._16_4_ = local_aec;
        local_500._20_4_ = local_aec;
        local_500._24_4_ = local_aec;
        local_500._28_4_ = local_aec;
        local_4a0 = vpcmpgtd_avx2(auVar92,local_500);
        local_460 = vpandn_avx2(local_4a0,local_480);
        auVar121 = ZEXT3264(local_460);
        auVar92 = local_480 & ~local_4a0;
        local_a40 = auVar11;
        local_a20 = auVar12;
        local_840 = auVar13;
        if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar92 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar92 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar92 >> 0x7f,0) == '\0') &&
              (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar92 >> 0xbf,0) == '\0') &&
            (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar92[0x1f]) {
          fVar123 = (ray->super_RayK<1>).tfar;
          auVar99._4_4_ = fVar123;
          auVar99._0_4_ = fVar123;
          auVar99._8_4_ = fVar123;
          auVar99._12_4_ = fVar123;
          auVar99._16_4_ = fVar123;
          auVar99._20_4_ = fVar123;
          auVar99._24_4_ = fVar123;
          auVar99._28_4_ = fVar123;
          local_5c0._0_4_ = local_420._0_4_;
          local_5c0._4_4_ = local_420._4_4_;
          fStack_5b8 = local_420._8_4_;
          fStack_5b4 = local_420._12_4_;
          fStack_5b0 = local_420._16_4_;
          fStack_5ac = local_420._20_4_;
          fStack_5a8 = local_420._24_4_;
          fStack_5a4 = local_420._28_4_;
          local_820 = local_420;
          auVar222 = ZEXT3264(local_940);
          fVar123 = (float)local_5c0._0_4_;
          fVar198 = (float)local_5c0._4_4_;
          fVar199 = fStack_5b8;
          fVar200 = fStack_5b4;
          fVar201 = fStack_5b0;
          fVar202 = fStack_5ac;
          fVar203 = fStack_5a8;
          fVar165 = fStack_5a4;
          fVar124 = fVar103;
          fVar125 = fVar103;
          fVar128 = fVar103;
          fVar126 = fVar103;
          fVar127 = fVar103;
          fVar185 = fVar103;
          _local_5c0 = auVar235;
        }
        else {
          _local_580 = auVar184;
          local_560 = auVar238;
          local_8c0._0_4_ = uVar186;
          auVar3 = vminps_avx(local_950,local_970);
          auVar85 = vmaxps_avx(local_950,local_970);
          auVar171 = vminps_avx(local_960,_local_980);
          auVar132 = vminps_avx(auVar3,auVar171);
          auVar3 = vmaxps_avx(local_960,_local_980);
          auVar171 = vmaxps_avx(auVar85,auVar3);
          auVar144._8_4_ = 0x7fffffff;
          auVar144._0_8_ = 0x7fffffff7fffffff;
          auVar144._12_4_ = 0x7fffffff;
          auVar85 = vandps_avx(auVar132,auVar144);
          local_700._0_16_ = auVar144;
          auVar3 = vandps_avx(auVar171,auVar144);
          auVar85 = vmaxps_avx(auVar85,auVar3);
          auVar3 = vmovshdup_avx(auVar85);
          auVar3 = vmaxss_avx(auVar3,auVar85);
          auVar85 = vshufpd_avx(auVar85,auVar85,1);
          auVar85 = vmaxss_avx(auVar85,auVar3);
          local_7c0._0_4_ = auVar85._0_4_ * 1.9073486e-06;
          local_820._0_16_ = vshufps_avx(auVar171,auVar171,0xff);
          local_6e0._4_4_ = (float)local_520._4_4_ + (float)local_7e0._4_4_;
          local_6e0._0_4_ = (float)local_520._0_4_ + (float)local_7e0._0_4_;
          fStack_6d8 = fStack_518 + fStack_7d8;
          fStack_6d4 = fStack_514 + fStack_7d4;
          fStack_6d0 = fStack_510 + fStack_7d0;
          fStack_6cc = fStack_50c + fStack_7cc;
          fStack_6c8 = fStack_508 + fStack_7c8;
          fStack_6c4 = fStack_504 + fStack_7c4;
          local_800._4_4_ = fVar103;
          local_800._0_4_ = fVar103;
          fStack_7f8 = fVar103;
          fStack_7f4 = fVar103;
          fStack_7f0 = fVar103;
          fStack_7ec = fVar103;
          fStack_7e8 = fVar103;
          fStack_7e4 = fVar103;
          local_880 = auVar134;
          local_660 = auVar14;
          _local_520 = auVar10;
          do {
            auVar100._8_4_ = 0x7f800000;
            auVar100._0_8_ = 0x7f8000007f800000;
            auVar100._12_4_ = 0x7f800000;
            auVar100._16_4_ = 0x7f800000;
            auVar100._20_4_ = 0x7f800000;
            auVar100._24_4_ = 0x7f800000;
            auVar100._28_4_ = 0x7f800000;
            auVar92 = auVar121._0_32_;
            auVar235 = vblendvps_avx(auVar100,_local_520,auVar92);
            auVar9 = vshufps_avx(auVar235,auVar235,0xb1);
            auVar9 = vminps_avx(auVar235,auVar9);
            auVar138 = vshufpd_avx(auVar9,auVar9,5);
            auVar9 = vminps_avx(auVar9,auVar138);
            auVar138 = vpermpd_avx2(auVar9,0x4e);
            auVar9 = vminps_avx(auVar9,auVar138);
            auVar235 = vcmpps_avx(auVar235,auVar9,0);
            auVar9 = auVar92 & auVar235;
            if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar9 >> 0x7f,0) != '\0') ||
                  (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar9 >> 0xbf,0) != '\0') ||
                (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar9[0x1f] < '\0') {
              auVar92 = vandps_avx(auVar235,auVar92);
            }
            uVar71 = vmovmskps_avx(auVar92);
            iVar15 = 0;
            for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            uVar72 = iVar15 << 2;
            *(undefined4 *)(local_460 + uVar72) = 0;
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            auVar85 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            uVar71 = *(uint *)(local_1a0 + uVar72);
            uVar72 = *(uint *)(local_3e0 + uVar72);
            if (auVar85._0_4_ < 0.0) {
              fVar103 = sqrtf(auVar85._0_4_);
            }
            else {
              auVar85 = vsqrtss_avx(auVar85,auVar85);
              fVar103 = auVar85._0_4_;
            }
            local_620._0_4_ = fVar103 * 1.9073486e-06;
            auVar85 = vinsertps_avx(ZEXT416(uVar72),ZEXT416(uVar71),0x10);
            auVar228 = ZEXT1664(auVar85);
            lVar74 = 5;
            do {
              auVar89 = auVar228._0_16_;
              auVar3 = vmovshdup_avx(auVar89);
              fVar128 = 1.0 - auVar3._0_4_;
              local_920._0_16_ = ZEXT416((uint)fVar128);
              auVar85 = vshufps_avx(auVar89,auVar89,0x55);
              fVar103 = auVar85._0_4_;
              auVar104._0_4_ = local_970._0_4_ * fVar103;
              fVar123 = auVar85._4_4_;
              auVar104._4_4_ = local_970._4_4_ * fVar123;
              fVar124 = auVar85._8_4_;
              auVar104._8_4_ = local_970._8_4_ * fVar124;
              fVar125 = auVar85._12_4_;
              auVar104._12_4_ = local_970._12_4_ * fVar125;
              auVar129._4_4_ = fVar128;
              auVar129._0_4_ = fVar128;
              auVar129._8_4_ = fVar128;
              auVar129._12_4_ = fVar128;
              auVar85 = vfmadd231ps_fma(auVar104,auVar129,local_950);
              auVar145._0_4_ = local_960._0_4_ * fVar103;
              auVar145._4_4_ = local_960._4_4_ * fVar123;
              auVar145._8_4_ = local_960._8_4_ * fVar124;
              auVar145._12_4_ = local_960._12_4_ * fVar125;
              auVar171 = vfmadd231ps_fma(auVar145,auVar129,local_970);
              auVar189._0_4_ = fVar103 * auVar171._0_4_;
              auVar189._4_4_ = fVar123 * auVar171._4_4_;
              auVar189._8_4_ = fVar124 * auVar171._8_4_;
              auVar189._12_4_ = fVar125 * auVar171._12_4_;
              auVar132 = vfmadd231ps_fma(auVar189,auVar129,auVar85);
              auVar105._0_4_ = fVar103 * (float)local_980._0_4_;
              auVar105._4_4_ = fVar123 * (float)local_980._4_4_;
              auVar105._8_4_ = fVar124 * fStack_978;
              auVar105._12_4_ = fVar125 * fStack_974;
              auVar85 = vfmadd231ps_fma(auVar105,auVar129,local_960);
              auVar170._0_4_ = fVar103 * auVar85._0_4_;
              auVar170._4_4_ = fVar123 * auVar85._4_4_;
              auVar170._8_4_ = fVar124 * auVar85._8_4_;
              auVar170._12_4_ = fVar125 * auVar85._12_4_;
              auVar171 = vfmadd231ps_fma(auVar170,auVar129,auVar171);
              fVar126 = auVar228._0_4_;
              auVar106._4_4_ = fVar126;
              auVar106._0_4_ = fVar126;
              auVar106._8_4_ = fVar126;
              auVar106._12_4_ = fVar126;
              auVar85 = vfmadd213ps_fma(auVar106,(undefined1  [16])aVar1,_DAT_01f7aa10);
              auVar84._0_4_ = fVar103 * auVar171._0_4_;
              auVar84._4_4_ = fVar123 * auVar171._4_4_;
              auVar84._8_4_ = fVar124 * auVar171._8_4_;
              auVar84._12_4_ = fVar125 * auVar171._12_4_;
              auVar192 = vfmadd231ps_fma(auVar84,auVar132,auVar129);
              local_600._0_16_ = auVar192;
              auVar85 = vsubps_avx(auVar85,auVar192);
              _local_7a0 = auVar85;
              auVar85 = vdpps_avx(auVar85,auVar85,0x7f);
              local_8a0._0_16_ = auVar85;
              if (auVar85._0_4_ < 0.0) {
                local_920._0_16_ = ZEXT416((uint)fVar128);
                local_a20._0_16_ = auVar132;
                local_a40._0_16_ = auVar171;
                auVar244._0_4_ = sqrtf(auVar85._0_4_);
                auVar244._4_60_ = extraout_var;
                auVar85 = auVar244._0_16_;
                auVar171 = local_a40._0_16_;
                auVar132 = local_a20._0_16_;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
              }
              auVar171 = vsubps_avx(auVar171,auVar132);
              auVar204._0_4_ = auVar171._0_4_ * 3.0;
              auVar204._4_4_ = auVar171._4_4_ * 3.0;
              auVar204._8_4_ = auVar171._8_4_ * 3.0;
              auVar204._12_4_ = auVar171._12_4_ * 3.0;
              auVar171 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_920._0_16_,auVar3);
              auVar132 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar3,local_920._0_16_);
              fVar103 = local_920._0_4_ * 6.0;
              fVar123 = auVar171._0_4_ * 6.0;
              fVar124 = auVar132._0_4_ * 6.0;
              fVar125 = auVar3._0_4_ * 6.0;
              auVar146._0_4_ = fVar125 * (float)local_980._0_4_;
              auVar146._4_4_ = fVar125 * (float)local_980._4_4_;
              auVar146._8_4_ = fVar125 * fStack_978;
              auVar146._12_4_ = fVar125 * fStack_974;
              auVar107._4_4_ = fVar124;
              auVar107._0_4_ = fVar124;
              auVar107._8_4_ = fVar124;
              auVar107._12_4_ = fVar124;
              auVar3 = vfmadd132ps_fma(auVar107,auVar146,local_960);
              auVar147._4_4_ = fVar123;
              auVar147._0_4_ = fVar123;
              auVar147._8_4_ = fVar123;
              auVar147._12_4_ = fVar123;
              auVar3 = vfmadd132ps_fma(auVar147,auVar3,local_970);
              auVar171 = vdpps_avx(auVar204,auVar204,0x7f);
              auVar108._4_4_ = fVar103;
              auVar108._0_4_ = fVar103;
              auVar108._8_4_ = fVar103;
              auVar108._12_4_ = fVar103;
              auVar192 = vfmadd132ps_fma(auVar108,auVar3,local_950);
              auVar3 = vblendps_avx(auVar171,_DAT_01f7aa10,0xe);
              auVar132 = vrsqrtss_avx(auVar3,auVar3);
              fVar124 = auVar171._0_4_;
              fVar103 = auVar132._0_4_;
              auVar132 = vdpps_avx(auVar204,auVar192,0x7f);
              fVar103 = fVar103 * 1.5 + fVar124 * -0.5 * fVar103 * fVar103 * fVar103;
              auVar109._0_4_ = auVar192._0_4_ * fVar124;
              auVar109._4_4_ = auVar192._4_4_ * fVar124;
              auVar109._8_4_ = auVar192._8_4_ * fVar124;
              auVar109._12_4_ = auVar192._12_4_ * fVar124;
              fVar123 = auVar132._0_4_;
              auVar190._0_4_ = auVar204._0_4_ * fVar123;
              auVar190._4_4_ = auVar204._4_4_ * fVar123;
              auVar190._8_4_ = auVar204._8_4_ * fVar123;
              auVar190._12_4_ = auVar204._12_4_ * fVar123;
              auVar132 = vsubps_avx(auVar109,auVar190);
              auVar3 = vrcpss_avx(auVar3,auVar3);
              auVar192 = vfnmadd213ss_fma(auVar3,auVar171,ZEXT416(0x40000000));
              fVar123 = auVar3._0_4_ * auVar192._0_4_;
              auVar3 = vmaxss_avx(ZEXT416((uint)local_7c0._0_4_),
                                  ZEXT416((uint)(fVar126 * (float)local_620._0_4_)));
              uVar16 = CONCAT44(auVar204._4_4_,auVar204._0_4_);
              auVar223._0_8_ = uVar16 ^ 0x8000000080000000;
              auVar223._8_4_ = -auVar204._8_4_;
              auVar223._12_4_ = -auVar204._12_4_;
              local_860._0_4_ = fVar103 * auVar132._0_4_ * fVar123;
              local_860._4_4_ = fVar103 * auVar132._4_4_ * fVar123;
              local_860._8_4_ = fVar103 * auVar132._8_4_ * fVar123;
              local_860._12_4_ = fVar103 * auVar132._12_4_ * fVar123;
              local_840._0_4_ = auVar204._0_4_ * fVar103;
              local_840._4_4_ = auVar204._4_4_ * fVar103;
              local_840._8_4_ = auVar204._8_4_ * fVar103;
              local_840._12_4_ = auVar204._12_4_ * fVar103;
              local_920._0_16_ = auVar204;
              if (fVar124 < -fVar124) {
                local_a20._0_4_ = auVar85._0_4_;
                local_a40._0_16_ = auVar223;
                fVar103 = sqrtf(fVar124);
                auVar85 = ZEXT416((uint)local_a20._0_4_);
                auVar223 = local_a40._0_16_;
              }
              else {
                auVar171 = vsqrtss_avx(auVar171,auVar171);
                fVar103 = auVar171._0_4_;
              }
              local_a20._0_16_ = vdpps_avx(_local_7a0,local_840._0_16_,0x7f);
              auVar192 = vfmadd213ss_fma(ZEXT416((uint)local_7c0._0_4_),auVar85,
                                         ZEXT416((uint)auVar3._0_4_));
              auVar171 = vdpps_avx(auVar223,local_840._0_16_,0x7f);
              auVar132 = vdpps_avx(_local_7a0,local_860._0_16_,0x7f);
              local_860._0_16_ = vdpps_avx((undefined1  [16])aVar1,local_840._0_16_,0x7f);
              auVar85 = vfmadd213ss_fma(ZEXT416((uint)(auVar85._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_7c0._0_4_ / fVar103)),auVar192);
              local_a40._0_4_ = auVar85._0_4_;
              auVar86._0_4_ = local_a20._0_4_ * local_a20._0_4_;
              auVar86._4_4_ = local_a20._4_4_ * local_a20._4_4_;
              auVar86._8_4_ = local_a20._8_4_ * local_a20._8_4_;
              auVar86._12_4_ = local_a20._12_4_ * local_a20._12_4_;
              auVar85 = vdpps_avx(_local_7a0,auVar223,0x7f);
              auVar211 = vsubps_avx(local_8a0._0_16_,auVar86);
              auVar192 = vrsqrtss_avx(auVar211,auVar211);
              fVar123 = auVar211._0_4_;
              fVar103 = auVar192._0_4_;
              fVar103 = fVar103 * 1.5 + fVar123 * -0.5 * fVar103 * fVar103 * fVar103;
              auVar192 = vdpps_avx(_local_7a0,(undefined1  [16])aVar1,0x7f);
              local_840._0_16_ = ZEXT416((uint)(auVar171._0_4_ + auVar132._0_4_));
              local_880._0_16_ = vfnmadd231ss_fma(auVar85,local_a20._0_16_,local_840._0_16_);
              auVar85 = vfnmadd231ss_fma(auVar192,local_a20._0_16_,local_860._0_16_);
              if (fVar123 < 0.0) {
                local_640._0_4_ = fVar103;
                local_660._0_16_ = auVar85;
                fVar123 = sqrtf(fVar123);
                fVar103 = (float)local_640._0_4_;
                auVar85 = local_660._0_16_;
              }
              else {
                auVar171 = vsqrtss_avx(auVar211,auVar211);
                fVar123 = auVar171._0_4_;
              }
              auVar244 = ZEXT3264(local_9a0);
              auVar252 = ZEXT3264(local_9c0);
              auVar258 = ZEXT3264(local_9e0);
              auVar222 = ZEXT3264(local_940);
              auVar225 = ZEXT3264(local_a00);
              auVar171 = vpermilps_avx(local_600._0_16_,0xff);
              fVar123 = fVar123 - auVar171._0_4_;
              auVar132 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xff);
              auVar171 = vfmsub213ss_fma(local_880._0_16_,ZEXT416((uint)fVar103),auVar132);
              auVar148._0_8_ = local_860._0_8_ ^ 0x8000000080000000;
              auVar148._8_4_ = local_860._8_4_ ^ 0x80000000;
              auVar148._12_4_ = local_860._12_4_ ^ 0x80000000;
              auVar172._0_8_ = auVar171._0_8_ ^ 0x8000000080000000;
              auVar172._8_4_ = auVar171._8_4_ ^ 0x80000000;
              auVar172._12_4_ = auVar171._12_4_ ^ 0x80000000;
              auVar216 = ZEXT1664(local_840._0_16_);
              auVar85 = ZEXT416((uint)(auVar85._0_4_ * fVar103));
              auVar171 = vfmsub231ss_fma(ZEXT416((uint)(local_860._0_4_ * auVar171._0_4_)),
                                         local_840._0_16_,auVar85);
              auVar85 = vinsertps_avx(auVar172,auVar85,0x1c);
              uVar186 = auVar171._0_4_;
              auVar173._4_4_ = uVar186;
              auVar173._0_4_ = uVar186;
              auVar173._8_4_ = uVar186;
              auVar173._12_4_ = uVar186;
              auVar85 = vdivps_avx(auVar85,auVar173);
              auVar171 = vinsertps_avx(local_840._0_16_,auVar148,0x10);
              auVar171 = vdivps_avx(auVar171,auVar173);
              fVar103 = local_a20._0_4_;
              auVar130._0_4_ = fVar103 * auVar85._0_4_ + fVar123 * auVar171._0_4_;
              auVar130._4_4_ = fVar103 * auVar85._4_4_ + fVar123 * auVar171._4_4_;
              auVar130._8_4_ = fVar103 * auVar85._8_4_ + fVar123 * auVar171._8_4_;
              auVar130._12_4_ = fVar103 * auVar85._12_4_ + fVar123 * auVar171._12_4_;
              auVar171 = vsubps_avx(auVar89,auVar130);
              auVar228 = ZEXT1664(auVar171);
              auVar85 = vandps_avx(local_a20._0_16_,local_700._0_16_);
              fVar124 = (float)local_800._4_4_;
              fVar125 = fStack_7f8;
              fVar128 = fStack_7f4;
              fVar126 = fStack_7f0;
              fVar127 = fStack_7ec;
              fVar185 = fStack_7e8;
              fVar103 = (float)local_800._0_4_;
              if (auVar85._0_4_ < (float)local_a40._0_4_) {
                auVar3 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a40._0_4_ + auVar3._0_4_)),
                                         local_820._0_16_,ZEXT416(0x36000000));
                auVar85 = vandps_avx(ZEXT416((uint)fVar123),local_700._0_16_);
                if (auVar85._0_4_ < auVar3._0_4_) {
                  fVar123 = auVar171._0_4_ + (float)local_780._0_4_;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar123) &&
                     (fVar198 = (ray->super_RayK<1>).tfar, fVar123 <= fVar198)) {
                    auVar85 = vmovshdup_avx(auVar171);
                    fVar199 = auVar85._0_4_;
                    if ((0.0 <= fVar199) && (fVar199 <= 1.0)) {
                      auVar85 = vrsqrtss_avx(local_8a0._0_16_,local_8a0._0_16_);
                      fVar200 = auVar85._0_4_;
                      pGVar7 = (context->scene->geometries).items[uVar73].ptr;
                      if ((pGVar7->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar200 = fVar200 * 1.5 +
                                  local_8a0._0_4_ * -0.5 * fVar200 * fVar200 * fVar200;
                        auVar149._0_4_ = fVar200 * (float)local_7a0._0_4_;
                        auVar149._4_4_ = fVar200 * (float)local_7a0._4_4_;
                        auVar149._8_4_ = fVar200 * fStack_798;
                        auVar149._12_4_ = fVar200 * fStack_794;
                        auVar192 = vfmadd213ps_fma(auVar132,auVar149,local_920._0_16_);
                        auVar85 = vshufps_avx(auVar149,auVar149,0xc9);
                        auVar3 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xc9);
                        auVar150._0_4_ = auVar149._0_4_ * auVar3._0_4_;
                        auVar150._4_4_ = auVar149._4_4_ * auVar3._4_4_;
                        auVar150._8_4_ = auVar149._8_4_ * auVar3._8_4_;
                        auVar150._12_4_ = auVar149._12_4_ * auVar3._12_4_;
                        auVar132 = vfmsub231ps_fma(auVar150,local_920._0_16_,auVar85);
                        auVar85 = vshufps_avx(auVar132,auVar132,0xc9);
                        auVar3 = vshufps_avx(auVar192,auVar192,0xc9);
                        auVar132 = vshufps_avx(auVar132,auVar132,0xd2);
                        auVar87._0_4_ = auVar192._0_4_ * auVar132._0_4_;
                        auVar87._4_4_ = auVar192._4_4_ * auVar132._4_4_;
                        auVar87._8_4_ = auVar192._8_4_ * auVar132._8_4_;
                        auVar87._12_4_ = auVar192._12_4_ * auVar132._12_4_;
                        auVar85 = vfmsub231ps_fma(auVar87,auVar85,auVar3);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar123;
                          auVar3 = vshufps_avx(auVar85,auVar85,0xe9);
                          uVar80 = vmovlps_avx(auVar3);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar80;
                          (ray->Ng).field_0.field_0.z = auVar85._0_4_;
                          ray->u = fVar199;
                          ray->v = 0.0;
                          ray->primID = local_8c0._0_4_;
                          ray->geomID = uVar73;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          auVar3 = vshufps_avx(auVar85,auVar85,0xe9);
                          local_8f0 = vmovlps_avx(auVar3);
                          local_8e8 = auVar85._0_4_;
                          local_8e4 = fVar199;
                          local_8e0 = 0;
                          local_8dc = local_8c0._0_4_;
                          local_8d8 = uVar73;
                          local_8d4 = context->user->instID[0];
                          local_8d0 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar123;
                          local_5e0._0_4_ = 0xffffffff;
                          local_a78.valid = (int *)local_5e0;
                          local_a78.geometryUserPtr = pGVar7->userPtr;
                          local_a78.context = context->user;
                          local_a78.hit = (RTCHitN *)&local_8f0;
                          local_a78.N = 1;
                          local_a78.ray = (RTCRayN *)ray;
                          if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0175e2cb:
                            p_Var8 = context->args->filter;
                            if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar216 = ZEXT1664(auVar216._0_16_);
                              auVar228 = ZEXT1664(auVar228._0_16_);
                              (*p_Var8)(&local_a78);
                              if (*local_a78.valid == 0) goto LAB_0175e35d;
                            }
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_a78.hit;
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_a78.hit + 4);
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_a78.hit + 8);
                            *(float *)((long)local_a78.ray + 0x3c) = *(float *)(local_a78.hit + 0xc)
                            ;
                            *(float *)((long)local_a78.ray + 0x40) =
                                 *(float *)(local_a78.hit + 0x10);
                            *(float *)((long)local_a78.ray + 0x44) =
                                 *(float *)(local_a78.hit + 0x14);
                            *(float *)((long)local_a78.ray + 0x48) =
                                 *(float *)(local_a78.hit + 0x18);
                            *(float *)((long)local_a78.ray + 0x4c) =
                                 *(float *)(local_a78.hit + 0x1c);
                            *(float *)((long)local_a78.ray + 0x50) =
                                 *(float *)(local_a78.hit + 0x20);
                          }
                          else {
                            auVar216 = ZEXT1664(local_840._0_16_);
                            auVar228 = ZEXT1664(auVar171);
                            (*pGVar7->intersectionFilterN)(&local_a78);
                            if (*local_a78.valid != 0) goto LAB_0175e2cb;
LAB_0175e35d:
                            (ray->super_RayK<1>).tfar = fVar198;
                          }
                          auVar244 = ZEXT3264(local_9a0);
                          auVar252 = ZEXT3264(local_9c0);
                          auVar258 = ZEXT3264(local_9e0);
                          auVar222 = ZEXT3264(local_940);
                          auVar225 = ZEXT3264(local_a00);
                          fVar103 = (float)local_800._0_4_;
                          fVar124 = (float)local_800._4_4_;
                          fVar125 = fStack_7f8;
                          fVar128 = fStack_7f4;
                          fVar126 = fStack_7f0;
                          fVar127 = fStack_7ec;
                          fVar185 = fStack_7e8;
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar74 = lVar74 + -1;
            } while (lVar74 != 0);
            auVar235 = local_460;
            fVar123 = (ray->super_RayK<1>).tfar;
            auVar99._4_4_ = fVar123;
            auVar99._0_4_ = fVar123;
            auVar99._8_4_ = fVar123;
            auVar99._12_4_ = fVar123;
            auVar99._16_4_ = fVar123;
            auVar99._20_4_ = fVar123;
            auVar99._24_4_ = fVar123;
            auVar99._28_4_ = fVar123;
            auVar92 = vcmpps_avx(_local_6e0,auVar99,2);
            local_460 = vandps_avx(auVar92,local_460);
            auVar121 = ZEXT3264(local_460);
            auVar235 = auVar235 & auVar92;
          } while ((((((((auVar235 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar235 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar235 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar235 >> 0x7f,0) != '\0') ||
                     (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar235 >> 0xbf,0) != '\0') ||
                   (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar235[0x1f] < '\0');
          auVar121 = ZEXT3264(local_420);
          local_820 = local_420;
          auVar239 = ZEXT3264(local_560);
          uVar186 = local_8c0._0_4_;
          auVar184 = _local_580;
          fVar123 = (float)local_5c0._0_4_;
          fVar198 = (float)local_5c0._4_4_;
          fVar199 = fStack_5b8;
          fVar200 = fStack_5b4;
          fVar201 = fStack_5b0;
          fVar202 = fStack_5ac;
          fVar203 = fStack_5a8;
          fVar165 = fStack_5a4;
        }
        auVar122._0_4_ = fVar103 * (float)local_5a0._0_4_;
        auVar122._4_4_ = fVar124 * (float)local_5a0._4_4_;
        auVar122._8_4_ = fVar125 * fStack_598;
        auVar122._12_4_ = fVar128 * fStack_594;
        auVar122._16_4_ = fVar126 * fStack_590;
        auVar122._20_4_ = fVar127 * fStack_58c;
        auVar122._28_36_ = auVar121._28_36_;
        auVar122._24_4_ = fVar185 * fStack_588;
        auVar85 = vfmadd213ps_fma(local_760,auVar184,auVar122._0_32_);
        auVar85 = vfmadd213ps_fma(local_740,auVar239._0_32_,ZEXT1632(auVar85));
        auVar92 = vandps_avx(ZEXT1632(auVar85),local_720);
        auVar140._8_4_ = 0x3e99999a;
        auVar140._0_8_ = 0x3e99999a3e99999a;
        auVar140._12_4_ = 0x3e99999a;
        auVar140._16_4_ = 0x3e99999a;
        auVar140._20_4_ = 0x3e99999a;
        auVar140._24_4_ = 0x3e99999a;
        auVar140._28_4_ = 0x3e99999a;
        auVar92 = vcmpps_avx(auVar92,auVar140,1);
        auVar235 = vorps_avx(auVar92,local_4e0);
        auVar141._0_4_ = (float)local_7e0._0_4_ + fVar123;
        auVar141._4_4_ = (float)local_7e0._4_4_ + fVar198;
        auVar141._8_4_ = fStack_7d8 + fVar199;
        auVar141._12_4_ = fStack_7d4 + fVar200;
        auVar141._16_4_ = fStack_7d0 + fVar201;
        auVar141._20_4_ = fStack_7cc + fVar202;
        auVar141._24_4_ = fStack_7c8 + fVar203;
        auVar141._28_4_ = fStack_7c4 + fVar165;
        auVar92 = vcmpps_avx(auVar141,auVar99,2);
        local_740 = vandps_avx(auVar92,local_4c0);
        auVar142._8_4_ = 3;
        auVar142._0_8_ = 0x300000003;
        auVar142._12_4_ = 3;
        auVar142._16_4_ = 3;
        auVar142._20_4_ = 3;
        auVar142._24_4_ = 3;
        auVar142._28_4_ = 3;
        auVar163._8_4_ = 2;
        auVar163._0_8_ = 0x200000002;
        auVar163._12_4_ = 2;
        auVar163._16_4_ = 2;
        auVar163._20_4_ = 2;
        auVar163._24_4_ = 2;
        auVar163._28_4_ = 2;
        auVar92 = vblendvps_avx(auVar163,auVar142,auVar235);
        local_760 = vpcmpgtd_avx2(auVar92,local_500);
        local_5e0 = vpandn_avx2(local_760,local_740);
        auVar92 = local_740 & ~local_760;
        if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar92 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar92 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar92 >> 0x7f,0) != '\0') ||
              (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar92 >> 0xbf,0) != '\0') ||
            (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar92[0x1f] < '\0') {
          local_8c0._0_4_ = uVar186;
          auVar3 = vminps_avx(local_950,local_970);
          auVar85 = vmaxps_avx(local_950,local_970);
          auVar171 = vminps_avx(local_960,_local_980);
          auVar132 = vminps_avx(auVar3,auVar171);
          auVar3 = vmaxps_avx(local_960,_local_980);
          auVar171 = vmaxps_avx(auVar85,auVar3);
          local_880._8_4_ = 0x7fffffff;
          local_880._0_8_ = 0x7fffffff7fffffff;
          local_880._12_4_ = 0x7fffffff;
          auVar85 = vandps_avx(auVar132,local_880._0_16_);
          auVar3 = vandps_avx(auVar171,local_880._0_16_);
          auVar85 = vmaxps_avx(auVar85,auVar3);
          auVar3 = vmovshdup_avx(auVar85);
          auVar3 = vmaxss_avx(auVar3,auVar85);
          auVar85 = vshufpd_avx(auVar85,auVar85,1);
          auVar85 = vmaxss_avx(auVar85,auVar3);
          local_7c0._0_4_ = auVar85._0_4_ * 1.9073486e-06;
          local_660._0_16_ = vshufps_avx(auVar171,auVar171,0xff);
          local_6e0._4_4_ = (float)local_7e0._4_4_ + local_420._4_4_;
          local_6e0._0_4_ = (float)local_7e0._0_4_ + local_420._0_4_;
          fStack_6d8 = fStack_7d8 + local_420._8_4_;
          fStack_6d4 = fStack_7d4 + local_420._12_4_;
          fStack_6d0 = fStack_7d0 + local_420._16_4_;
          fStack_6cc = fStack_7cc + local_420._20_4_;
          fStack_6c8 = fStack_7c8 + local_420._24_4_;
          fStack_6c4 = fStack_7c4 + local_420._28_4_;
          local_820 = local_420;
          do {
            auVar101._8_4_ = 0x7f800000;
            auVar101._0_8_ = 0x7f8000007f800000;
            auVar101._12_4_ = 0x7f800000;
            auVar101._16_4_ = 0x7f800000;
            auVar101._20_4_ = 0x7f800000;
            auVar101._24_4_ = 0x7f800000;
            auVar101._28_4_ = 0x7f800000;
            auVar92 = vblendvps_avx(auVar101,local_820,local_5e0);
            auVar235 = vshufps_avx(auVar92,auVar92,0xb1);
            auVar235 = vminps_avx(auVar92,auVar235);
            auVar9 = vshufpd_avx(auVar235,auVar235,5);
            auVar235 = vminps_avx(auVar235,auVar9);
            auVar9 = vpermpd_avx2(auVar235,0x4e);
            auVar235 = vminps_avx(auVar235,auVar9);
            auVar235 = vcmpps_avx(auVar92,auVar235,0);
            auVar9 = local_5e0 & auVar235;
            auVar92 = local_5e0;
            if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar9 >> 0x7f,0) != '\0') ||
                  (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar9 >> 0xbf,0) != '\0') ||
                (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar9[0x1f] < '\0') {
              auVar92 = vandps_avx(auVar235,local_5e0);
            }
            uVar71 = vmovmskps_avx(auVar92);
            iVar15 = 0;
            for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            uVar72 = iVar15 << 2;
            *(undefined4 *)(local_5e0 + uVar72) = 0;
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_8a0._0_16_ = (undefined1  [16])aVar1;
            auVar85 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            uVar71 = *(uint *)(local_1c0 + uVar72);
            uVar72 = *(uint *)(local_400 + uVar72);
            if (auVar85._0_4_ < 0.0) {
              fVar103 = sqrtf(auVar85._0_4_);
            }
            else {
              auVar85 = vsqrtss_avx(auVar85,auVar85);
              fVar103 = auVar85._0_4_;
            }
            local_700._0_4_ = fVar103 * 1.9073486e-06;
            auVar85 = vinsertps_avx(ZEXT416(uVar72),ZEXT416(uVar71),0x10);
            lVar74 = 5;
            do {
              auVar171 = vmovshdup_avx(auVar85);
              fVar128 = 1.0 - auVar171._0_4_;
              local_920._0_16_ = ZEXT416((uint)fVar128);
              auVar3 = vshufps_avx(auVar85,auVar85,0x55);
              fVar103 = auVar3._0_4_;
              auVar110._0_4_ = local_970._0_4_ * fVar103;
              fVar123 = auVar3._4_4_;
              auVar110._4_4_ = local_970._4_4_ * fVar123;
              fVar124 = auVar3._8_4_;
              auVar110._8_4_ = local_970._8_4_ * fVar124;
              fVar125 = auVar3._12_4_;
              auVar110._12_4_ = local_970._12_4_ * fVar125;
              auVar131._4_4_ = fVar128;
              auVar131._0_4_ = fVar128;
              auVar131._8_4_ = fVar128;
              auVar131._12_4_ = fVar128;
              auVar3 = vfmadd231ps_fma(auVar110,auVar131,local_950);
              auVar151._0_4_ = local_960._0_4_ * fVar103;
              auVar151._4_4_ = local_960._4_4_ * fVar123;
              auVar151._8_4_ = local_960._8_4_ * fVar124;
              auVar151._12_4_ = local_960._12_4_ * fVar125;
              auVar132 = vfmadd231ps_fma(auVar151,auVar131,local_970);
              auVar191._0_4_ = fVar103 * auVar132._0_4_;
              auVar191._4_4_ = fVar123 * auVar132._4_4_;
              auVar191._8_4_ = fVar124 * auVar132._8_4_;
              auVar191._12_4_ = fVar125 * auVar132._12_4_;
              auVar192 = vfmadd231ps_fma(auVar191,auVar131,auVar3);
              auVar111._0_4_ = fVar103 * (float)local_980._0_4_;
              auVar111._4_4_ = fVar123 * (float)local_980._4_4_;
              auVar111._8_4_ = fVar124 * fStack_978;
              auVar111._12_4_ = fVar125 * fStack_974;
              auVar3 = vfmadd231ps_fma(auVar111,auVar131,local_960);
              auVar174._0_4_ = fVar103 * auVar3._0_4_;
              auVar174._4_4_ = fVar123 * auVar3._4_4_;
              auVar174._8_4_ = fVar124 * auVar3._8_4_;
              auVar174._12_4_ = fVar125 * auVar3._12_4_;
              auVar132 = vfmadd231ps_fma(auVar174,auVar131,auVar132);
              fVar126 = auVar85._0_4_;
              auVar112._4_4_ = fVar126;
              auVar112._0_4_ = fVar126;
              auVar112._8_4_ = fVar126;
              auVar112._12_4_ = fVar126;
              auVar3 = vfmadd213ps_fma(auVar112,local_8a0._0_16_,_DAT_01f7aa10);
              auVar88._0_4_ = fVar103 * auVar132._0_4_;
              auVar88._4_4_ = fVar123 * auVar132._4_4_;
              auVar88._8_4_ = fVar124 * auVar132._8_4_;
              auVar88._12_4_ = fVar125 * auVar132._12_4_;
              auVar89 = vfmadd231ps_fma(auVar88,auVar192,auVar131);
              local_600._0_16_ = auVar89;
              auVar3 = vsubps_avx(auVar3,auVar89);
              _local_7a0 = auVar3;
              auVar3 = vdpps_avx(auVar3,auVar3,0x7f);
              fVar103 = auVar3._0_4_;
              if (fVar103 < 0.0) {
                local_920._0_16_ = ZEXT416((uint)fVar128);
                local_a20._0_16_ = auVar192;
                local_a40._0_16_ = auVar132;
                auVar252._0_4_ = sqrtf(fVar103);
                auVar252._4_60_ = extraout_var_00;
                auVar89 = auVar252._0_16_;
                auVar132 = local_a40._0_16_;
                auVar192 = local_a20._0_16_;
              }
              else {
                auVar89 = vsqrtss_avx(auVar3,auVar3);
              }
              auVar132 = vsubps_avx(auVar132,auVar192);
              auVar210._0_4_ = auVar132._0_4_ * 3.0;
              auVar210._4_4_ = auVar132._4_4_ * 3.0;
              auVar210._8_4_ = auVar132._8_4_ * 3.0;
              auVar210._12_4_ = auVar132._12_4_ * 3.0;
              auVar132 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_920._0_16_,auVar171);
              auVar192 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar171,local_920._0_16_);
              fVar123 = local_920._0_4_ * 6.0;
              fVar124 = auVar132._0_4_ * 6.0;
              fVar125 = auVar192._0_4_ * 6.0;
              fVar128 = auVar171._0_4_ * 6.0;
              auVar152._0_4_ = fVar128 * (float)local_980._0_4_;
              auVar152._4_4_ = fVar128 * (float)local_980._4_4_;
              auVar152._8_4_ = fVar128 * fStack_978;
              auVar152._12_4_ = fVar128 * fStack_974;
              auVar113._4_4_ = fVar125;
              auVar113._0_4_ = fVar125;
              auVar113._8_4_ = fVar125;
              auVar113._12_4_ = fVar125;
              auVar171 = vfmadd132ps_fma(auVar113,auVar152,local_960);
              auVar153._4_4_ = fVar124;
              auVar153._0_4_ = fVar124;
              auVar153._8_4_ = fVar124;
              auVar153._12_4_ = fVar124;
              auVar171 = vfmadd132ps_fma(auVar153,auVar171,local_970);
              auVar132 = vdpps_avx(auVar210,auVar210,0x7f);
              auVar114._4_4_ = fVar123;
              auVar114._0_4_ = fVar123;
              auVar114._8_4_ = fVar123;
              auVar114._12_4_ = fVar123;
              auVar211 = vfmadd132ps_fma(auVar114,auVar171,local_950);
              auVar171 = vblendps_avx(auVar132,_DAT_01f7aa10,0xe);
              auVar192 = vrsqrtss_avx(auVar171,auVar171);
              fVar125 = auVar132._0_4_;
              fVar123 = auVar192._0_4_;
              auVar192 = vdpps_avx(auVar210,auVar211,0x7f);
              fVar123 = fVar123 * 1.5 + fVar125 * -0.5 * fVar123 * fVar123 * fVar123;
              auVar115._0_4_ = auVar211._0_4_ * fVar125;
              auVar115._4_4_ = auVar211._4_4_ * fVar125;
              auVar115._8_4_ = auVar211._8_4_ * fVar125;
              auVar115._12_4_ = auVar211._12_4_ * fVar125;
              fVar124 = auVar192._0_4_;
              auVar193._0_4_ = auVar210._0_4_ * fVar124;
              auVar193._4_4_ = auVar210._4_4_ * fVar124;
              auVar193._8_4_ = auVar210._8_4_ * fVar124;
              auVar193._12_4_ = auVar210._12_4_ * fVar124;
              auVar192 = vsubps_avx(auVar115,auVar193);
              auVar171 = vrcpss_avx(auVar171,auVar171);
              auVar211 = vfnmadd213ss_fma(auVar171,auVar132,ZEXT416(0x40000000));
              fVar124 = auVar171._0_4_ * auVar211._0_4_;
              auVar171 = vmaxss_avx(ZEXT416((uint)local_7c0._0_4_),
                                    ZEXT416((uint)(fVar126 * (float)local_700._0_4_)));
              uVar16 = CONCAT44(auVar210._4_4_,auVar210._0_4_);
              auVar227._0_8_ = uVar16 ^ 0x8000000080000000;
              auVar227._8_4_ = -auVar210._8_4_;
              auVar227._12_4_ = -auVar210._12_4_;
              local_860._0_4_ = fVar123 * auVar192._0_4_ * fVar124;
              local_860._4_4_ = fVar123 * auVar192._4_4_ * fVar124;
              local_860._8_4_ = fVar123 * auVar192._8_4_ * fVar124;
              local_860._12_4_ = fVar123 * auVar192._12_4_ * fVar124;
              local_840._0_4_ = auVar210._0_4_ * fVar123;
              local_840._4_4_ = auVar210._4_4_ * fVar123;
              local_840._8_4_ = auVar210._8_4_ * fVar123;
              local_840._12_4_ = auVar210._12_4_ * fVar123;
              local_920._0_16_ = auVar210;
              if (fVar125 < -fVar125) {
                local_a20._0_4_ = auVar89._0_4_;
                local_a40._0_16_ = auVar227;
                fVar123 = sqrtf(fVar125);
                auVar89 = ZEXT416((uint)local_a20._0_4_);
                auVar227 = local_a40._0_16_;
              }
              else {
                auVar132 = vsqrtss_avx(auVar132,auVar132);
                fVar123 = auVar132._0_4_;
              }
              local_a20._0_16_ = vdpps_avx(_local_7a0,local_840._0_16_,0x7f);
              auVar211 = vfmadd213ss_fma(ZEXT416((uint)local_7c0._0_4_),auVar89,
                                         ZEXT416((uint)auVar171._0_4_));
              auVar132 = vdpps_avx(auVar227,local_840._0_16_,0x7f);
              auVar192 = vdpps_avx(_local_7a0,local_860._0_16_,0x7f);
              local_840._0_16_ = vdpps_avx(local_8a0._0_16_,local_840._0_16_,0x7f);
              auVar89 = vfmadd213ss_fma(ZEXT416((uint)(auVar89._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_7c0._0_4_ / fVar123)),auVar211);
              local_a40._0_4_ = auVar89._0_4_;
              fVar123 = auVar132._0_4_ + auVar192._0_4_;
              auVar216 = ZEXT464((uint)fVar123);
              auVar90._0_4_ = local_a20._0_4_ * local_a20._0_4_;
              auVar90._4_4_ = local_a20._4_4_ * local_a20._4_4_;
              auVar90._8_4_ = local_a20._8_4_ * local_a20._8_4_;
              auVar90._12_4_ = local_a20._12_4_ * local_a20._12_4_;
              auVar132 = vdpps_avx(_local_7a0,auVar227,0x7f);
              auVar89 = vsubps_avx(auVar3,auVar90);
              auVar192 = vrsqrtss_avx(auVar89,auVar89);
              fVar125 = auVar89._0_4_;
              fVar124 = auVar192._0_4_;
              fVar124 = fVar124 * 1.5 + fVar125 * -0.5 * fVar124 * fVar124 * fVar124;
              auVar192 = vdpps_avx(_local_7a0,local_8a0._0_16_,0x7f);
              local_860._0_16_ = vfnmadd231ss_fma(auVar132,local_a20._0_16_,ZEXT416((uint)fVar123));
              auVar132 = vfnmadd231ss_fma(auVar192,local_a20._0_16_,local_840._0_16_);
              if (fVar125 < 0.0) {
                local_620._0_16_ = ZEXT416((uint)fVar123);
                local_800._0_4_ = fVar124;
                local_640._0_16_ = auVar132;
                fVar123 = sqrtf(fVar125);
                auVar216 = ZEXT1664(local_620._0_16_);
                fVar124 = (float)local_800._0_4_;
                auVar132 = local_640._0_16_;
              }
              else {
                auVar192 = vsqrtss_avx(auVar89,auVar89);
                fVar123 = auVar192._0_4_;
              }
              auVar239 = ZEXT1664(auVar3);
              auVar244 = ZEXT3264(local_9a0);
              auVar252 = ZEXT3264(local_9c0);
              auVar258 = ZEXT3264(local_9e0);
              auVar222 = ZEXT3264(local_940);
              auVar225 = ZEXT3264(local_a00);
              auVar228 = ZEXT1664(local_920._0_16_);
              auVar192 = vpermilps_avx(local_600._0_16_,0xff);
              fVar123 = fVar123 - auVar192._0_4_;
              auVar89 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xff);
              auVar192 = vfmsub213ss_fma(local_860._0_16_,ZEXT416((uint)fVar124),auVar89);
              auVar154._0_8_ = local_840._0_8_ ^ 0x8000000080000000;
              auVar154._8_4_ = local_840._8_4_ ^ 0x80000000;
              auVar154._12_4_ = local_840._12_4_ ^ 0x80000000;
              auVar175._0_8_ = auVar192._0_8_ ^ 0x8000000080000000;
              auVar175._8_4_ = auVar192._8_4_ ^ 0x80000000;
              auVar175._12_4_ = auVar192._12_4_ ^ 0x80000000;
              auVar132 = ZEXT416((uint)(auVar132._0_4_ * fVar124));
              auVar211 = auVar216._0_16_;
              auVar192 = vfmsub231ss_fma(ZEXT416((uint)(auVar192._0_4_ * local_840._0_4_)),auVar211,
                                         auVar132);
              auVar132 = vinsertps_avx(auVar175,auVar132,0x1c);
              uVar186 = auVar192._0_4_;
              auVar176._4_4_ = uVar186;
              auVar176._0_4_ = uVar186;
              auVar176._8_4_ = uVar186;
              auVar176._12_4_ = uVar186;
              auVar132 = vdivps_avx(auVar132,auVar176);
              auVar192 = vinsertps_avx(auVar211,auVar154,0x10);
              auVar192 = vdivps_avx(auVar192,auVar176);
              fVar124 = local_a20._0_4_;
              auVar133._0_4_ = fVar124 * auVar132._0_4_ + fVar123 * auVar192._0_4_;
              auVar133._4_4_ = fVar124 * auVar132._4_4_ + fVar123 * auVar192._4_4_;
              auVar133._8_4_ = fVar124 * auVar132._8_4_ + fVar123 * auVar192._8_4_;
              auVar133._12_4_ = fVar124 * auVar132._12_4_ + fVar123 * auVar192._12_4_;
              auVar85 = vsubps_avx(auVar85,auVar133);
              auVar132 = vandps_avx(local_a20._0_16_,local_880._0_16_);
              if (auVar132._0_4_ < (float)local_a40._0_4_) {
                auVar132 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a40._0_4_ + auVar171._0_4_)),
                                           local_660._0_16_,ZEXT416(0x36000000));
                auVar171 = vandps_avx(ZEXT416((uint)fVar123),local_880._0_16_);
                if (auVar171._0_4_ < auVar132._0_4_) {
                  fVar123 = auVar85._0_4_ + (float)local_780._0_4_;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar123) &&
                     (fVar124 = (ray->super_RayK<1>).tfar, fVar123 <= fVar124)) {
                    auVar85 = vmovshdup_avx(auVar85);
                    fVar125 = auVar85._0_4_;
                    if ((0.0 <= fVar125) && (fVar125 <= 1.0)) {
                      auVar85 = vrsqrtss_avx(auVar3,auVar3);
                      fVar128 = auVar85._0_4_;
                      pGVar7 = (context->scene->geometries).items[uVar73].ptr;
                      if ((pGVar7->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar103 = fVar128 * 1.5 + fVar103 * -0.5 * fVar128 * fVar128 * fVar128;
                        auVar155._0_4_ = fVar103 * (float)local_7a0._0_4_;
                        auVar155._4_4_ = fVar103 * (float)local_7a0._4_4_;
                        auVar155._8_4_ = fVar103 * fStack_798;
                        auVar155._12_4_ = fVar103 * fStack_794;
                        auVar192 = vfmadd213ps_fma(auVar89,auVar155,local_920._0_16_);
                        auVar85 = vshufps_avx(auVar155,auVar155,0xc9);
                        auVar171 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xc9);
                        auVar156._0_4_ = auVar155._0_4_ * auVar171._0_4_;
                        auVar156._4_4_ = auVar155._4_4_ * auVar171._4_4_;
                        auVar156._8_4_ = auVar155._8_4_ * auVar171._8_4_;
                        auVar156._12_4_ = auVar155._12_4_ * auVar171._12_4_;
                        auVar132 = vfmsub231ps_fma(auVar156,local_920._0_16_,auVar85);
                        auVar85 = vshufps_avx(auVar132,auVar132,0xc9);
                        auVar171 = vshufps_avx(auVar192,auVar192,0xc9);
                        auVar132 = vshufps_avx(auVar132,auVar132,0xd2);
                        auVar91._0_4_ = auVar192._0_4_ * auVar132._0_4_;
                        auVar91._4_4_ = auVar192._4_4_ * auVar132._4_4_;
                        auVar91._8_4_ = auVar192._8_4_ * auVar132._8_4_;
                        auVar91._12_4_ = auVar192._12_4_ * auVar132._12_4_;
                        auVar85 = vfmsub231ps_fma(auVar91,auVar85,auVar171);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar123;
                          auVar3 = vshufps_avx(auVar85,auVar85,0xe9);
                          uVar80 = vmovlps_avx(auVar3);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar80;
                          (ray->Ng).field_0.field_0.z = auVar85._0_4_;
                          ray->u = fVar125;
                          ray->v = 0.0;
                          ray->primID = local_8c0._0_4_;
                          ray->geomID = uVar73;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          auVar171 = vshufps_avx(auVar85,auVar85,0xe9);
                          local_8f0 = vmovlps_avx(auVar171);
                          local_8e8 = auVar85._0_4_;
                          local_8e4 = fVar125;
                          local_8e0 = 0;
                          local_8dc = local_8c0._0_4_;
                          local_8d8 = uVar73;
                          local_8d4 = context->user->instID[0];
                          local_8d0 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar123;
                          local_a44 = -1;
                          local_a78.valid = &local_a44;
                          local_a78.geometryUserPtr = pGVar7->userPtr;
                          local_a78.context = context->user;
                          local_a78.hit = (RTCHitN *)&local_8f0;
                          local_a78.N = 1;
                          local_a78.ray = (RTCRayN *)ray;
                          if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0175ed0a:
                            p_Var8 = context->args->filter;
                            if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar216 = ZEXT1664(auVar216._0_16_);
                              auVar228 = ZEXT1664(auVar228._0_16_);
                              auVar239 = ZEXT1664(auVar239._0_16_);
                              (*p_Var8)(&local_a78);
                              if (*local_a78.valid == 0) goto LAB_0175ed9c;
                            }
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_a78.hit;
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_a78.hit + 4);
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_a78.hit + 8);
                            *(float *)((long)local_a78.ray + 0x3c) = *(float *)(local_a78.hit + 0xc)
                            ;
                            *(float *)((long)local_a78.ray + 0x40) =
                                 *(float *)(local_a78.hit + 0x10);
                            *(float *)((long)local_a78.ray + 0x44) =
                                 *(float *)(local_a78.hit + 0x14);
                            *(float *)((long)local_a78.ray + 0x48) =
                                 *(float *)(local_a78.hit + 0x18);
                            *(float *)((long)local_a78.ray + 0x4c) =
                                 *(float *)(local_a78.hit + 0x1c);
                            *(float *)((long)local_a78.ray + 0x50) =
                                 *(float *)(local_a78.hit + 0x20);
                          }
                          else {
                            auVar216 = ZEXT1664(auVar211);
                            auVar228 = ZEXT1664(local_920._0_16_);
                            auVar239 = ZEXT1664(auVar3);
                            (*pGVar7->intersectionFilterN)(&local_a78);
                            if (*local_a78.valid != 0) goto LAB_0175ed0a;
LAB_0175ed9c:
                            (ray->super_RayK<1>).tfar = fVar124;
                          }
                          auVar244 = ZEXT3264(local_9a0);
                          auVar252 = ZEXT3264(local_9c0);
                          auVar258 = ZEXT3264(local_9e0);
                          auVar222 = ZEXT3264(local_940);
                          auVar225 = ZEXT3264(local_a00);
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar74 = lVar74 + -1;
            } while (lVar74 != 0);
            auVar235 = local_5e0;
            fVar103 = (ray->super_RayK<1>).tfar;
            auVar99._4_4_ = fVar103;
            auVar99._0_4_ = fVar103;
            auVar99._8_4_ = fVar103;
            auVar99._12_4_ = fVar103;
            auVar99._16_4_ = fVar103;
            auVar99._20_4_ = fVar103;
            auVar99._24_4_ = fVar103;
            auVar99._28_4_ = fVar103;
            auVar92 = vcmpps_avx(_local_6e0,auVar99,2);
            local_5e0 = vandps_avx(auVar92,local_5e0);
            auVar235 = auVar235 & auVar92;
          } while ((((((((auVar235 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar235 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar235 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar235 >> 0x7f,0) != '\0') ||
                     (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar235 >> 0xbf,0) != '\0') ||
                   (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar235[0x1f] < '\0');
          uVar186 = local_8c0._0_4_;
        }
        auVar143._0_4_ = (float)local_7e0._0_4_ + local_3e0._0_4_;
        auVar143._4_4_ = (float)local_7e0._4_4_ + local_3e0._4_4_;
        auVar143._8_4_ = fStack_7d8 + local_3e0._8_4_;
        auVar143._12_4_ = fStack_7d4 + local_3e0._12_4_;
        auVar143._16_4_ = fStack_7d0 + local_3e0._16_4_;
        auVar143._20_4_ = fStack_7cc + local_3e0._20_4_;
        auVar143._24_4_ = fStack_7c8 + local_3e0._24_4_;
        auVar143._28_4_ = fStack_7c4 + local_3e0._28_4_;
        auVar235 = vcmpps_avx(auVar143,auVar99,2);
        auVar92 = vandps_avx(local_4a0,local_480);
        auVar92 = vandps_avx(auVar235,auVar92);
        auVar164._0_4_ = (float)local_7e0._0_4_ + local_420._0_4_;
        auVar164._4_4_ = (float)local_7e0._4_4_ + local_420._4_4_;
        auVar164._8_4_ = fStack_7d8 + local_420._8_4_;
        auVar164._12_4_ = fStack_7d4 + local_420._12_4_;
        auVar164._16_4_ = fStack_7d0 + local_420._16_4_;
        auVar164._20_4_ = fStack_7cc + local_420._20_4_;
        auVar164._24_4_ = fStack_7c8 + local_420._24_4_;
        auVar164._28_4_ = fStack_7c4 + local_420._28_4_;
        auVar9 = vcmpps_avx(auVar164,auVar99,2);
        auVar235 = vandps_avx(local_760,local_740);
        auVar235 = vandps_avx(auVar9,auVar235);
        auVar235 = vorps_avx(auVar92,auVar235);
        if ((((((((auVar235 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar235 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar235 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar235 >> 0x7f,0) != '\0') ||
              (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar235 >> 0xbf,0) != '\0') ||
            (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar235[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar78 * 0x60) = auVar235;
          auVar92 = vblendvps_avx(local_420,local_3e0,auVar92);
          *(undefined1 (*) [32])(auStack_160 + uVar78 * 0x60) = auVar92;
          uVar80 = vmovlps_avx(local_430);
          (&uStack_140)[uVar78 * 0xc] = uVar80;
          aiStack_138[uVar78 * 0x18] = local_aec + 1;
          iVar77 = iVar77 + 1;
        }
      }
    }
    fVar103 = (ray->super_RayK<1>).tfar;
    auVar96._4_4_ = fVar103;
    auVar96._0_4_ = fVar103;
    auVar96._8_4_ = fVar103;
    auVar96._12_4_ = fVar103;
    auVar96._16_4_ = fVar103;
    auVar96._20_4_ = fVar103;
    auVar96._24_4_ = fVar103;
    auVar96._28_4_ = fVar103;
    if (iVar77 == 0) break;
    uVar71 = -iVar77;
    pauVar70 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar77 - 1) * 0x60);
    fVar103 = (float)local_7e0._0_4_;
    fVar123 = (float)local_7e0._4_4_;
    fVar124 = fStack_7d8;
    fVar125 = fStack_7d4;
    fVar128 = fStack_7d0;
    fVar126 = fStack_7cc;
    fVar127 = fStack_7c8;
    fVar185 = fStack_7c4;
    while( true ) {
      auVar92 = pauVar70[1];
      auVar117._0_4_ = fVar103 + auVar92._0_4_;
      auVar117._4_4_ = fVar123 + auVar92._4_4_;
      auVar117._8_4_ = fVar124 + auVar92._8_4_;
      auVar117._12_4_ = fVar125 + auVar92._12_4_;
      auVar117._16_4_ = fVar128 + auVar92._16_4_;
      auVar117._20_4_ = fVar126 + auVar92._20_4_;
      auVar117._24_4_ = fVar127 + auVar92._24_4_;
      auVar117._28_4_ = fVar185 + auVar92._28_4_;
      auVar9 = vcmpps_avx(auVar117,auVar96,2);
      auVar235 = vandps_avx(auVar9,*pauVar70);
      local_3e0 = auVar235;
      auVar9 = *pauVar70 & auVar9;
      if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar9 >> 0x7f,0) != '\0') ||
            (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar9 >> 0xbf,0) != '\0') ||
          (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar9[0x1f] < '\0')
      break;
      pauVar70 = pauVar70 + -3;
      uVar71 = uVar71 + 1;
      fVar103 = (float)local_7e0._0_4_;
      fVar123 = (float)local_7e0._4_4_;
      fVar124 = fStack_7d8;
      fVar125 = fStack_7d4;
      fVar128 = fStack_7d0;
      fVar126 = fStack_7cc;
      fVar127 = fStack_7c8;
      fVar185 = fStack_7c4;
      if (uVar71 == 0) goto LAB_0175ef58;
    }
    auVar97._8_4_ = 0x7f800000;
    auVar97._0_8_ = 0x7f8000007f800000;
    auVar97._12_4_ = 0x7f800000;
    auVar97._16_4_ = 0x7f800000;
    auVar97._20_4_ = 0x7f800000;
    auVar97._24_4_ = 0x7f800000;
    auVar97._28_4_ = 0x7f800000;
    auVar92 = vblendvps_avx(auVar97,auVar92,auVar235);
    auVar9 = vshufps_avx(auVar92,auVar92,0xb1);
    auVar9 = vminps_avx(auVar92,auVar9);
    auVar138 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vminps_avx(auVar9,auVar138);
    auVar138 = vpermpd_avx2(auVar9,0x4e);
    auVar9 = vminps_avx(auVar9,auVar138);
    auVar92 = vcmpps_avx(auVar92,auVar9,0);
    auVar9 = auVar235 & auVar92;
    if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar9 >> 0x7f,0) != '\0') ||
          (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar9 >> 0xbf,0) != '\0') ||
        (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar9[0x1f] < '\0') {
      auVar235 = vandps_avx(auVar92,auVar235);
    }
    uVar16 = *(ulong *)pauVar70[2];
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar16;
    uVar72 = vmovmskps_avx(auVar235);
    iVar77 = 0;
    for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
      iVar77 = iVar77 + 1;
    }
    *(undefined4 *)(local_3e0 + (uint)(iVar77 << 2)) = 0;
    uVar72 = ~uVar71;
    if ((((((((local_3e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_3e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_3e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_3e0 >> 0x7f,0) != '\0') ||
          (local_3e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_3e0 >> 0xbf,0) != '\0') ||
        (local_3e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_3e0[0x1f] < '\0') {
      uVar72 = -uVar71;
    }
    uVar78 = (ulong)uVar72;
    local_aec = *(int *)(pauVar70[2] + 8);
    *pauVar70 = local_3e0;
    uVar79 = (undefined4)uVar16;
    auVar118._4_4_ = uVar79;
    auVar118._0_4_ = uVar79;
    auVar118._8_4_ = uVar79;
    auVar118._12_4_ = uVar79;
    auVar118._16_4_ = uVar79;
    auVar118._20_4_ = uVar79;
    auVar118._24_4_ = uVar79;
    auVar118._28_4_ = uVar79;
    auVar85 = vmovshdup_avx(auVar83);
    auVar85 = vsubps_avx(auVar85,auVar83);
    auVar98._0_4_ = auVar85._0_4_;
    auVar98._4_4_ = auVar98._0_4_;
    auVar98._8_4_ = auVar98._0_4_;
    auVar98._12_4_ = auVar98._0_4_;
    auVar98._16_4_ = auVar98._0_4_;
    auVar98._20_4_ = auVar98._0_4_;
    auVar98._24_4_ = auVar98._0_4_;
    auVar98._28_4_ = auVar98._0_4_;
    auVar85 = vfmadd132ps_fma(auVar98,auVar118,_DAT_01faff20);
    local_420 = ZEXT1632(auVar85);
    local_430._8_8_ = 0;
    local_430._0_8_ = *(ulong *)(local_420 + (uint)(iVar77 << 2));
  } while( true );
LAB_0175ef58:
  auVar92 = vcmpps_avx(local_320,auVar96,2);
  uVar73 = vmovmskps_avx(auVar92);
  uVar73 = (uint)uVar76 & uVar73;
  if (uVar73 == 0) {
    return;
  }
  goto LAB_0175ca14;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }